

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4HC_compress_optimal
              (LZ4HC_CCtx_internal *ctx,char *source,char *dst,int *srcSizePtr,int dstCapacity,
              int nbSearches,size_t sufficient_len,limitedOutput_directive limit,int fullUpdate,
              dictCtx_directive dict,HCfavor_e favorDecSpeed)

{
  long lVar1;
  long lVar2;
  long lVar3;
  BYTE BVar4;
  char *pcVar5;
  HCfavor_e HVar6;
  dictCtx_directive dVar7;
  U16 UVar8;
  U16 UVar9;
  int iVar10;
  uint uVar11;
  U32 UVar12;
  uint uVar13;
  U32 UVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  U32 UVar18;
  int iVar19;
  int iVar20;
  BYTE *pBVar21;
  long lVar22;
  BYTE *pBVar23;
  void *pvVar24;
  reg_t rVar25;
  reg_t rVar26;
  ulong uVar27;
  BYTE *pBVar28;
  BYTE *pBVar29;
  bool bVar30;
  int local_10a4;
  ulong local_1060;
  uint local_1058;
  BYTE *local_1050;
  BYTE *local_1048;
  long local_1040;
  uint local_fbc;
  ulong local_f80;
  uint local_f78;
  BYTE *local_f70;
  BYTE *local_f68;
  long local_f60;
  uint local_ee0;
  ulong local_e90;
  uint local_e88;
  BYTE *local_e80;
  BYTE *local_e78;
  long local_e70;
  uint local_dec;
  size_t maxMlSize;
  size_t bytesLeftForMl;
  BYTE *maxLitPos;
  size_t ll_totalCost;
  size_t ll_addbytes;
  size_t ll_1;
  size_t accumulator;
  size_t totalSize;
  size_t llAdd;
  size_t lastRunSize;
  int offset_2;
  int ml_1;
  int rPos_1;
  int next_offset;
  int next_matchLength;
  int selected_offset;
  int selected_matchLength;
  int candidate_pos;
  int addLit_1;
  int ll;
  int price_7;
  int offset_1;
  int pos_4;
  int ml;
  int matchML_1;
  int pos_3;
  int price_4;
  int litlen;
  int baseLitlen;
  int local_d38;
  int iStack_d34;
  LZ4HC_match_t newMatch;
  BYTE *curPtr;
  int addLit;
  int cost_1;
  int offset;
  int matchML;
  int mlen;
  int cost;
  int rPos;
  BYTE *matchPos;
  int firstML;
  LZ4HC_match_t firstMatch;
  int last_match_pos;
  int cur;
  int best_off;
  int best_mlen;
  int llen;
  BYTE *ovref;
  BYTE *pBStack_cd0;
  int ovml;
  BYTE *oend;
  BYTE *opSaved;
  BYTE *op;
  BYTE *matchlimit;
  BYTE *mflimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  LZ4HC_optimal_t *opt;
  U32 local_c80;
  int retval;
  int nbSearches_local;
  int dstCapacity_local;
  int *srcSizePtr_local;
  char *dst_local;
  char *source_local;
  LZ4HC_CCtx_internal *ctx_local;
  size_t len_2;
  BYTE *token_2;
  size_t length_2;
  int local_c34;
  long local_c30;
  int local_c24;
  BYTE **local_c20;
  BYTE **local_c18;
  BYTE **local_c10;
  undefined4 local_c04;
  BYTE *local_c00;
  size_t len_1;
  BYTE *token_1;
  size_t length_1;
  limitedOutput_directive local_bdc;
  long local_bd8;
  int local_bcc;
  BYTE **local_bc8;
  BYTE **local_bc0;
  BYTE **local_bb8;
  int local_bac;
  BYTE *local_ba8;
  size_t len;
  BYTE *token;
  size_t length;
  limitedOutput_directive local_b84;
  long local_b80;
  int local_b74;
  BYTE **local_b70;
  BYTE **local_b68;
  BYTE **local_b60;
  int local_b54;
  BYTE *local_b50;
  BYTE *e;
  BYTE *s;
  BYTE *d;
  BYTE *local_b30;
  BYTE *local_b28;
  BYTE *local_b20;
  BYTE *e_1;
  BYTE *s_1;
  BYTE *d_1;
  BYTE *local_b00;
  BYTE *local_af8;
  BYTE *local_af0;
  BYTE *e_2;
  BYTE *s_2;
  BYTE *d_2;
  BYTE *local_ad0;
  BYTE *local_ac8;
  int local_abc;
  void *pvStack_ab8;
  int matchLength_4;
  BYTE *matchPtr_10;
  U32 local_aa8;
  int local_aa4;
  BYTE *local_aa0;
  BYTE *local_a98;
  char *local_a90;
  int local_a84;
  int iStack_a80;
  LZ4HC_match_t match_2;
  U32 nextOffset_2;
  BYTE *vLimit_5;
  int back_16;
  int mlt_2;
  BYTE *matchPtr_14;
  U32 dictMatchIndex_2;
  size_t dictEndOffset_2;
  U32 distToNextPattern_2;
  size_t maxML_2;
  U32 newMatchIndex_5;
  U32 newMatchIndex_4;
  U32 rotatedPattern_5;
  size_t currentSegmentLength_2;
  size_t backLength_2;
  BYTE *lowestMatchPtr_2;
  size_t sStack_a10;
  U32 rotatedPattern_4;
  size_t forwardPatternLength_2;
  BYTE *iLimit_2;
  BYTE *dictStart_5;
  BYTE *matchPtr_13;
  int extDict_2;
  U32 matchCandidateIdx_2;
  U32 distNextMatch_2;
  U32 candidateDist_2;
  int pos_2;
  int accel_2;
  int step_2;
  int end_2;
  U32 distanceToNextMatch_2;
  int kTrigger_2;
  BYTE *vLimit_4;
  int back_14;
  BYTE *dictStart_4;
  BYTE *matchPtr_12;
  int back_12;
  BYTE *matchPtr_11;
  ulong uStack_990;
  int matchLength_5;
  size_t srcPatternLength_2;
  repeat_state_e repeat_2;
  U32 matchIndex_2;
  U32 pattern_2;
  U32 matchChainPos_2;
  int nbAttempts_2;
  int lookBackLength_2;
  BYTE *dictBase_2;
  U32 lowestMatchIndex_2;
  U32 ipIndex_2;
  BYTE *lowPrefixPtr_2;
  U32 dictLimit_2;
  BYTE *base_4;
  LZ4HC_CCtx_internal *dictCtx_2;
  U32 *HashTable_2;
  U16 *chainTable_4;
  int local_904;
  size_t delta_2;
  uint local_8d0;
  U32 h_2;
  U32 idx_2;
  U32 target_2;
  BYTE *base_5;
  U32 *hashTable_2;
  U16 *chainTable_5;
  int min_6;
  int back_13;
  int min_7;
  int back_15;
  int min_8;
  int back_17;
  reg_t diff_17;
  reg_t diff_16;
  BYTE *pStart_8;
  BYTE *local_808;
  BYTE *local_800;
  uint local_7f4;
  reg_t diff_21;
  reg_t diff_20;
  BYTE *pStart_10;
  BYTE *local_7d0;
  BYTE *local_7c8;
  uint local_7bc;
  reg_t diff_19;
  reg_t diff_18;
  BYTE *pStart_9;
  BYTE *local_798;
  BYTE *local_790;
  uint local_784;
  reg_t diff_23;
  reg_t diff_22;
  BYTE *pStart_11;
  BYTE *local_760;
  BYTE *local_758;
  uint local_750;
  int local_74c;
  int iStack_748;
  int matchLength_2;
  BYTE *matchPtr_5;
  int local_714;
  int iStack_710;
  LZ4HC_match_t match_1;
  U32 nextOffset_1;
  BYTE *vLimit_3;
  int back_10;
  int mlt_1;
  BYTE *matchPtr_9;
  U32 dictMatchIndex_1;
  size_t dictEndOffset_1;
  U32 distToNextPattern_1;
  size_t maxML_1;
  U32 newMatchIndex_3;
  U32 newMatchIndex_2;
  U32 rotatedPattern_3;
  size_t currentSegmentLength_1;
  size_t backLength_1;
  BYTE *lowestMatchPtr_1;
  size_t sStack_6a0;
  U32 rotatedPattern_2;
  size_t forwardPatternLength_1;
  BYTE *iLimit_1;
  BYTE *dictStart_3;
  BYTE *matchPtr_8;
  int extDict_1;
  U32 matchCandidateIdx_1;
  U32 distNextMatch_1;
  U32 candidateDist_1;
  int pos_1;
  int accel_1;
  int step_1;
  int end_1;
  U32 distanceToNextMatch_1;
  int kTrigger_1;
  BYTE *vLimit_2;
  int back_8;
  BYTE *dictStart_2;
  BYTE *matchPtr_7;
  int back_6;
  BYTE *matchPtr_6;
  ulong uStack_620;
  int matchLength_3;
  size_t srcPatternLength_1;
  repeat_state_e repeat_1;
  U32 matchIndex_1;
  U32 pattern_1;
  U32 matchChainPos_1;
  int nbAttempts_1;
  int lookBackLength_1;
  BYTE *dictBase_1;
  U32 lowestMatchIndex_1;
  U32 ipIndex_1;
  BYTE *lowPrefixPtr_1;
  U32 dictLimit_1;
  BYTE *base_2;
  LZ4HC_CCtx_internal *dictCtx_1;
  U32 *HashTable_1;
  U16 *chainTable_2;
  int local_594;
  size_t delta_1;
  uint local_560;
  U32 h_1;
  U32 idx_1;
  U32 target_1;
  BYTE *base_3;
  U32 *hashTable_1;
  U16 *chainTable_3;
  int min_3;
  int back_7;
  int min_4;
  int back_9;
  int min_5;
  int back_11;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  BYTE *local_498;
  BYTE *local_490;
  uint local_484;
  reg_t diff_13;
  reg_t diff_12;
  BYTE *pStart_6;
  BYTE *local_460;
  BYTE *local_458;
  uint local_44c;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  BYTE *local_428;
  BYTE *local_420;
  uint local_414;
  reg_t diff_15;
  reg_t diff_14;
  BYTE *pStart_7;
  BYTE *local_3f0;
  BYTE *local_3e8;
  uint local_3e0;
  int local_3dc;
  int iStack_3d8;
  int matchLength;
  BYTE *matchPtr;
  int local_3a4;
  int iStack_3a0;
  LZ4HC_match_t match;
  U32 nextOffset;
  BYTE *vLimit_1;
  int back_4;
  int mlt;
  BYTE *matchPtr_4;
  U32 dictMatchIndex;
  size_t dictEndOffset;
  U32 distToNextPattern;
  size_t maxML;
  U32 newMatchIndex_1;
  U32 newMatchIndex;
  U32 rotatedPattern_1;
  size_t currentSegmentLength;
  size_t backLength;
  BYTE *lowestMatchPtr;
  size_t sStack_330;
  U32 rotatedPattern;
  size_t forwardPatternLength;
  BYTE *iLimit;
  BYTE *dictStart_1;
  BYTE *matchPtr_3;
  int extDict;
  U32 matchCandidateIdx;
  U32 distNextMatch;
  U32 candidateDist;
  int pos;
  int accel;
  int step;
  int end;
  U32 distanceToNextMatch;
  int kTrigger;
  BYTE *vLimit;
  int back_2;
  BYTE *dictStart;
  BYTE *matchPtr_2;
  int back;
  BYTE *matchPtr_1;
  ulong uStack_2b0;
  int matchLength_1;
  size_t srcPatternLength;
  repeat_state_e repeat;
  U32 matchIndex;
  U32 pattern;
  U32 matchChainPos;
  int nbAttempts;
  int lookBackLength;
  BYTE *dictBase;
  U32 lowestMatchIndex;
  U32 ipIndex;
  BYTE *lowPrefixPtr;
  U32 dictLimit;
  BYTE *base;
  LZ4HC_CCtx_internal *dictCtx;
  U32 *HashTable;
  U16 *chainTable;
  int local_224;
  size_t delta;
  uint local_1f0;
  U32 h;
  U32 idx;
  U32 target;
  BYTE *base_1;
  U32 *hashTable;
  U16 *chainTable_1;
  int min;
  int back_1;
  int min_1;
  int back_3;
  int min_2;
  int back_5;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  BYTE *local_128;
  BYTE *local_120;
  uint local_114;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  BYTE *local_f0;
  BYTE *local_e8;
  uint local_dc;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  BYTE *local_b8;
  BYTE *local_b0;
  uint local_a4;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  BYTE *local_80;
  BYTE *local_78;
  uint local_70;
  int local_6c;
  int price_12;
  int price_6;
  int price_5;
  int price_3;
  int price;
  int price_10;
  int price_11;
  int price_8;
  int local_24;
  int price_9;
  int price_1;
  int local_10;
  int price_2;
  
  opt._4_4_ = 0;
  local_c80 = nbSearches;
  retval = dstCapacity;
  _nbSearches_local = srcSizePtr;
  srcSizePtr_local = (int *)dst;
  dst_local = source;
  source_local = (char *)ctx;
  ip = (BYTE *)malloc(0x10030);
  anchor = (BYTE *)dst_local;
  iend = (BYTE *)dst_local;
  mflimit = (BYTE *)(dst_local + *_nbSearches_local);
  matchlimit = mflimit + -0xc;
  op = mflimit + -5;
  opSaved = (BYTE *)srcSizePtr_local;
  pBStack_cd0 = (BYTE *)((long)srcSizePtr_local + (long)retval);
  if (ip != (BYTE *)0x0) {
    *_nbSearches_local = 0;
    if (limit == fillOutput) {
      pBStack_cd0 = pBStack_cd0 + -5;
    }
    if (0xfff < sufficient_len) {
      sufficient_len = 0xfff;
    }
LAB_00175c7c:
    do {
      pcVar5 = source_local;
      pattern = local_c80;
      pBVar23 = anchor;
      pBVar28 = op;
      if (matchlimit < anchor) goto LAB_0017cecc;
      iVar20 = (int)anchor;
      iVar10 = iVar20 - (int)iend;
      memset(&local_3a4,0,8);
      _iStack_3d8 = (void *)0x0;
      local_224 = 3;
      lVar1 = *(long *)(pcVar5 + 0x40028);
      lVar2 = *(long *)(pcVar5 + 0x40008);
      uVar17 = *(uint *)(pcVar5 + 0x40018);
      pBVar21 = (BYTE *)(lVar2 + (ulong)uVar17);
      uVar11 = iVar20 - (int)lVar2;
      if (uVar11 < *(int *)(pcVar5 + 0x4001c) + 0x10000U) {
        local_dec = *(uint *)(pcVar5 + 0x4001c);
      }
      else {
        local_dec = uVar11 - 0xffff;
      }
      lVar22 = *(long *)(pcVar5 + 0x40010);
      matchIndex = 0;
      UVar12 = LZ4_read32(pBVar23);
      srcPatternLength._0_4_ = 0;
      uStack_2b0 = 0;
      lVar3 = *(long *)(pcVar5 + 0x40008);
      uVar13 = iVar20 - (int)lVar3;
      for (local_1f0 = *(uint *)(pcVar5 + 0x40020); local_1f0 < uVar13; local_1f0 = local_1f0 + 1) {
        UVar14 = LZ4HC_hashPtr((void *)(lVar3 + (ulong)local_1f0));
        uVar15 = local_1f0 - *(int *)(pcVar5 + (ulong)UVar14 * 4);
        if (0xffff < uVar15) {
          uVar15 = 0xffff;
        }
        *(short *)(pcVar5 + (ulong)(local_1f0 & 0xffff) * 2 + 0x20000) = (short)uVar15;
        *(uint *)(pcVar5 + (ulong)UVar14 * 4) = local_1f0;
      }
      *(uint *)(pcVar5 + 0x40020) = uVar13;
      UVar14 = LZ4HC_hashPtr(pBVar23);
      srcPatternLength._4_4_ = *(uint *)(pcVar5 + (ulong)UVar14 * 4);
LAB_00176065:
      if (local_dec <= srcPatternLength._4_4_ && 0 < (int)pattern) {
        matchPtr_1._4_4_ = 0;
        pattern = pattern - 1;
        if ((favorDecSpeed == favorCompressionRatio) || (7 < uVar11 - srcPatternLength._4_4_)) {
          if (srcPatternLength._4_4_ < uVar17) {
            pvVar24 = (void *)(lVar22 + (ulong)srcPatternLength._4_4_);
            UVar14 = LZ4_read32(pvVar24);
            if (UVar14 != UVar12) goto LAB_00176e15;
            _distanceToNextMatch = pBVar23 + (uVar17 - srcPatternLength._4_4_);
            if (pBVar28 < _distanceToNextMatch) {
              _distanceToNextMatch = pBVar28;
            }
            pBVar29 = pBVar23 + 4;
            local_b8 = (BYTE *)((long)pvVar24 + 4);
            local_b0 = pBVar29;
            if (pBVar29 < _distanceToNextMatch + -7) {
              rVar25 = LZ4_read_ARCH(local_b8);
              rVar26 = LZ4_read_ARCH(pBVar29);
              if ((rVar25 ^ rVar26) == 0) {
                local_b8 = (BYTE *)((long)pvVar24 + 0xc);
                local_b0 = pBVar23 + 0xc;
                goto LAB_00176762;
              }
              local_a4 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
            }
            else {
LAB_00176762:
              for (; local_b0 < _distanceToNextMatch + -7; local_b0 = local_b0 + 8) {
                rVar25 = LZ4_read_ARCH(local_b8);
                rVar26 = LZ4_read_ARCH(local_b0);
                if ((rVar25 ^ rVar26) != 0) {
                  uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                  local_a4 = ((int)local_b0 + uVar13) - (int)pBVar29;
                  goto LAB_00176948;
                }
                local_b8 = local_b8 + 8;
              }
              if (local_b0 < _distanceToNextMatch + -3) {
                UVar14 = LZ4_read32(local_b8);
                UVar18 = LZ4_read32(local_b0);
                if (UVar14 == UVar18) {
                  local_b0 = local_b0 + 4;
                  local_b8 = local_b8 + 4;
                }
              }
              if (local_b0 < _distanceToNextMatch + -1) {
                UVar8 = LZ4_read16(local_b8);
                UVar9 = LZ4_read16(local_b0);
                if (UVar8 == UVar9) {
                  local_b0 = local_b0 + 2;
                  local_b8 = local_b8 + 2;
                }
              }
              if ((local_b0 < _distanceToNextMatch) && (*local_b8 == *local_b0)) {
                local_b0 = local_b0 + 1;
              }
              local_a4 = (int)local_b0 - (int)pBVar29;
            }
LAB_00176948:
            matchPtr_1._4_4_ = local_a4 + 4;
            if ((pBVar23 + matchPtr_1._4_4_ == _distanceToNextMatch) &&
               (_distanceToNextMatch < pBVar28)) {
              pBVar29 = pBVar23 + matchPtr_1._4_4_;
              local_f0 = pBVar21;
              local_e8 = pBVar29;
              if (pBVar29 < pBVar28 + -7) {
                rVar25 = LZ4_read_ARCH(pBVar21);
                rVar26 = LZ4_read_ARCH(pBVar29);
                if ((rVar25 ^ rVar26) == 0) {
                  local_f0 = pBVar21 + 8;
                  local_e8 = pBVar29 + 8;
                  goto LAB_00176a65;
                }
                local_dc = LZ4_NbCommonBytes(rVar25 ^ rVar26);
              }
              else {
LAB_00176a65:
                for (; local_e8 < pBVar28 + -7; local_e8 = local_e8 + 8) {
                  rVar25 = LZ4_read_ARCH(local_f0);
                  rVar26 = LZ4_read_ARCH(local_e8);
                  if ((rVar25 ^ rVar26) != 0) {
                    uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                    local_dc = ((int)local_e8 + uVar13) - (int)pBVar29;
                    goto LAB_00176c4b;
                  }
                  local_f0 = local_f0 + 8;
                }
                if (local_e8 < pBVar28 + -3) {
                  UVar14 = LZ4_read32(local_f0);
                  UVar18 = LZ4_read32(local_e8);
                  if (UVar14 == UVar18) {
                    local_e8 = local_e8 + 4;
                    local_f0 = local_f0 + 4;
                  }
                }
                if (local_e8 < pBVar28 + -1) {
                  UVar8 = LZ4_read16(local_f0);
                  UVar9 = LZ4_read16(local_e8);
                  if (UVar8 == UVar9) {
                    local_e8 = local_e8 + 2;
                    local_f0 = local_f0 + 2;
                  }
                }
                if ((local_e8 < pBVar28) && (*local_f0 == *local_e8)) {
                  local_e8 = local_e8 + 1;
                }
                local_dc = (int)local_e8 - (int)pBVar29;
              }
LAB_00176c4b:
              matchPtr_1._4_4_ = local_dc + matchPtr_1._4_4_;
            }
            if (local_224 < matchPtr_1._4_4_) {
              _iStack_3d8 = (void *)(lVar2 + (ulong)srcPatternLength._4_4_);
              local_224 = matchPtr_1._4_4_;
            }
          }
          else {
            pvVar24 = (void *)(lVar2 + (ulong)srcPatternLength._4_4_);
            UVar8 = LZ4_read16(pBVar23 + (long)local_224 + -1);
            UVar9 = LZ4_read16((void *)((long)pvVar24 + (long)local_224 + -1));
            if ((UVar8 != UVar9) || (UVar14 = LZ4_read32(pvVar24), UVar14 != UVar12))
            goto LAB_00176e15;
            pBVar29 = pBVar23 + 4;
            local_128 = (BYTE *)((long)pvVar24 + 4);
            local_120 = pBVar29;
            if (pBVar29 < pBVar28 + -7) {
              rVar25 = LZ4_read_ARCH(local_128);
              rVar26 = LZ4_read_ARCH(pBVar29);
              if ((rVar25 ^ rVar26) == 0) {
                local_128 = (BYTE *)((long)pvVar24 + 0xc);
                local_120 = pBVar23 + 0xc;
                goto LAB_00176392;
              }
              local_114 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
            }
            else {
LAB_00176392:
              for (; local_120 < pBVar28 + -7; local_120 = local_120 + 8) {
                rVar25 = LZ4_read_ARCH(local_128);
                rVar26 = LZ4_read_ARCH(local_120);
                if ((rVar25 ^ rVar26) != 0) {
                  uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                  local_114 = ((int)local_120 + uVar13) - (int)pBVar29;
                  goto LAB_00176578;
                }
                local_128 = local_128 + 8;
              }
              if (local_120 < pBVar28 + -3) {
                UVar14 = LZ4_read32(local_128);
                UVar18 = LZ4_read32(local_120);
                if (UVar14 == UVar18) {
                  local_120 = local_120 + 4;
                  local_128 = local_128 + 4;
                }
              }
              if (local_120 < pBVar28 + -1) {
                UVar8 = LZ4_read16(local_128);
                UVar9 = LZ4_read16(local_120);
                if (UVar8 == UVar9) {
                  local_120 = local_120 + 2;
                  local_128 = local_128 + 2;
                }
              }
              if ((local_120 < pBVar28) && (*local_128 == *local_120)) {
                local_120 = local_120 + 1;
              }
              local_114 = (int)local_120 - (int)pBVar29;
            }
LAB_00176578:
            matchPtr_1._4_4_ = local_114 + 4;
            if (local_224 < matchPtr_1._4_4_) {
              _iStack_3d8 = pvVar24;
              local_224 = matchPtr_1._4_4_;
            }
          }
        }
LAB_00176e15:
        if ((matchPtr_1._4_4_ != local_224) || (uVar11 < srcPatternLength._4_4_ + local_224)) {
LAB_00176f5c:
          if ((*(short *)(pcVar5 + (ulong)(srcPatternLength._4_4_ & 0xffff) * 2 + 0x20000) == 1) &&
             (matchIndex == 0)) {
            uVar13 = srcPatternLength._4_4_ - 1;
            if ((int)srcPatternLength == 0) {
              if ((UVar12 & 0xffff) == UVar12 >> 0x10 && (UVar12 & 0xff) == UVar12 >> 0x18) {
                srcPatternLength._0_4_ = 2;
                uVar15 = LZ4HC_countPattern(pBVar23 + 4,pBVar28,UVar12);
                uStack_2b0 = (ulong)uVar15 + 4;
              }
              else {
                srcPatternLength._0_4_ = 1;
              }
            }
            if ((((int)srcPatternLength == 2) && (local_dec <= uVar13)) &&
               (iVar19 = LZ4HC_protectDictEnd(uVar17,uVar13), iVar19 != 0)) {
              bVar30 = uVar13 < uVar17;
              local_e70 = lVar2;
              if (bVar30) {
                local_e70 = lVar22;
              }
              pBVar29 = (BYTE *)(local_e70 + (ulong)uVar13);
              UVar14 = LZ4_read32(pBVar29);
              if (UVar14 == UVar12) {
                uVar15 = *(uint *)(pcVar5 + 0x4001c);
                if (bVar30) {
                  local_e78 = (BYTE *)(lVar22 + (ulong)uVar17);
                }
                else {
                  local_e78 = pBVar28;
                }
                uVar16 = LZ4HC_countPattern(pBVar29 + 4,local_e78,UVar12);
                sStack_330 = (ulong)uVar16 + 4;
                if ((bVar30) && (pBVar29 + sStack_330 == local_e78)) {
                  UVar14 = LZ4HC_rotatePattern(sStack_330,UVar12);
                  uVar16 = LZ4HC_countPattern(pBVar21,pBVar28,UVar14);
                  sStack_330 = uVar16 + sStack_330;
                }
                local_e80 = pBVar21;
                if (bVar30) {
                  local_e80 = (BYTE *)(lVar22 + (ulong)uVar15);
                }
                currentSegmentLength._0_4_ = LZ4HC_reverseCountPattern(pBVar29,local_e80,UVar12);
                if (((!bVar30) && (pBVar29 + -(ulong)(uint)currentSegmentLength == pBVar21)) &&
                   (*(uint *)(pcVar5 + 0x4001c) < uVar17)) {
                  UVar14 = LZ4HC_rotatePattern((ulong)-(uint)currentSegmentLength,UVar12);
                  uVar15 = LZ4HC_reverseCountPattern
                                     ((BYTE *)(lVar22 + (ulong)uVar17),
                                      (BYTE *)(lVar22 + (ulong)uVar15),UVar14);
                  currentSegmentLength._0_4_ = uVar15 + (uint)currentSegmentLength;
                }
                if (local_dec < uVar13 - (uint)currentSegmentLength) {
                  local_e88 = uVar13 - (uint)currentSegmentLength;
                }
                else {
                  local_e88 = local_dec;
                }
                local_e90 = (uVar13 - local_e88) + sStack_330;
                srcPatternLength._4_4_ = uVar17;
                if ((local_e90 < uStack_2b0) || (uStack_2b0 < sStack_330)) {
                  uVar13 = uVar13 - (uVar13 - local_e88);
                  iVar19 = LZ4HC_protectDictEnd(uVar17,uVar13);
                  if (iVar19 != 0) {
                    if (uStack_2b0 <= local_e90) {
                      local_e90 = uStack_2b0;
                    }
                    if ((ulong)(long)local_224 < local_e90) {
                      if ((BYTE *)0xffff < pBVar23 + (-(ulong)uVar13 - lVar2)) goto LAB_00177516;
                      local_224 = (int)local_e90;
                      _iStack_3d8 = (void *)(lVar2 + (ulong)uVar13);
                    }
                    if (uVar13 < *(ushort *)(pcVar5 + (ulong)(uVar13 & 0xffff) * 2 + 0x20000))
                    goto LAB_00177516;
                    srcPatternLength._4_4_ =
                         uVar13 - *(ushort *)(pcVar5 + (ulong)(uVar13 & 0xffff) * 2 + 0x20000);
                  }
                }
                else {
                  UVar14 = (uVar13 + (int)sStack_330) - (int)uStack_2b0;
                  iVar19 = LZ4HC_protectDictEnd(uVar17,UVar14);
                  if (iVar19 != 0) {
                    srcPatternLength._4_4_ = UVar14;
                  }
                }
                goto LAB_00176065;
              }
            }
          }
          srcPatternLength._4_4_ =
               srcPatternLength._4_4_ -
               *(ushort *)
                (pcVar5 + (ulong)(srcPatternLength._4_4_ + matchIndex & 0xffff) * 2 + 0x20000);
          goto LAB_00176065;
        }
        step = 1;
        candidateDist = 0x10;
        for (distNextMatch = 0; (int)distNextMatch < local_224 + -3;
            distNextMatch = iVar19 + distNextMatch) {
          iVar19 = (int)candidateDist >> 4;
          candidateDist = candidateDist + 1;
          if ((uint)step <
              (uint)*(ushort *)
                     (pcVar5 + (ulong)(srcPatternLength._4_4_ + distNextMatch & 0xffff) * 2 +
                               0x20000)) {
            matchIndex = distNextMatch;
            candidateDist = 0x10;
            step = (uint)*(ushort *)
                          (pcVar5 + (ulong)(srcPatternLength._4_4_ + distNextMatch & 0xffff) * 2 +
                                    0x20000);
          }
        }
        if ((uint)step < 2) goto LAB_00176f5c;
        if (srcPatternLength._4_4_ < (uint)step) goto LAB_00177516;
        srcPatternLength._4_4_ = srcPatternLength._4_4_ - step;
        goto LAB_00176065;
      }
LAB_00177516:
      if (((dict == usingDictCtxHc) && (0 < (int)pattern)) && (uVar11 - local_dec < 0xffff)) {
        lVar22 = *(long *)(lVar1 + 0x40000) - *(long *)(lVar1 + 0x40008);
        UVar14 = LZ4HC_hashPtr(pBVar23);
        matchPtr_4._4_4_ = *(uint *)(lVar1 + (ulong)UVar14 * 4);
        srcPatternLength._4_4_ = (matchPtr_4._4_4_ + local_dec) - (int)lVar22;
        while( true ) {
          UVar14 = pattern;
          bVar30 = uVar11 - srcPatternLength._4_4_ < 0x10000;
          if (bVar30) {
            pattern = pattern - 1;
          }
          if (!bVar30 || UVar14 == 0) break;
          pvVar24 = (void *)(*(long *)(lVar1 + 0x40008) + (ulong)matchPtr_4._4_4_);
          UVar14 = LZ4_read32(pvVar24);
          if (UVar14 == UVar12) {
            register0x00000000 = pBVar23 + (lVar22 - (ulong)matchPtr_4._4_4_);
            if (pBVar28 < register0x00000000) {
              stack0xfffffffffffffc68 = pBVar28;
            }
            pBVar21 = stack0xfffffffffffffc68;
            pBVar29 = pBVar23 + 4;
            local_80 = (BYTE *)((long)pvVar24 + 4);
            local_78 = pBVar29;
            if (pBVar29 < stack0xfffffffffffffc68 + -7) {
              rVar25 = LZ4_read_ARCH(local_80);
              rVar26 = LZ4_read_ARCH(pBVar29);
              if ((rVar25 ^ rVar26) == 0) {
                local_80 = (BYTE *)((long)pvVar24 + 0xc);
                local_78 = pBVar23 + 0xc;
                goto LAB_00177730;
              }
              local_70 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
            }
            else {
LAB_00177730:
              for (; local_78 < pBVar21 + -7; local_78 = local_78 + 8) {
                rVar25 = LZ4_read_ARCH(local_80);
                rVar26 = LZ4_read_ARCH(local_78);
                if ((rVar25 ^ rVar26) != 0) {
                  uVar17 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                  local_70 = ((int)local_78 + uVar17) - (int)pBVar29;
                  goto LAB_001778a7;
                }
                local_80 = local_80 + 8;
              }
              if (local_78 < pBVar21 + -3) {
                UVar14 = LZ4_read32(local_80);
                UVar18 = LZ4_read32(local_78);
                if (UVar14 == UVar18) {
                  local_78 = local_78 + 4;
                  local_80 = local_80 + 4;
                }
              }
              if (local_78 < pBVar21 + -1) {
                UVar8 = LZ4_read16(local_80);
                UVar9 = LZ4_read16(local_78);
                if (UVar8 == UVar9) {
                  local_78 = local_78 + 2;
                  local_80 = local_80 + 2;
                }
              }
              if ((local_78 < pBVar21) && (*local_80 == *local_78)) {
                local_78 = local_78 + 1;
              }
              local_70 = (int)local_78 - (int)pBVar29;
            }
LAB_001778a7:
            if (local_224 < (int)(local_70 + 4)) {
              _iStack_3d8 = (void *)(lVar2 + (ulong)srcPatternLength._4_4_);
              local_224 = local_70 + 4;
            }
          }
          match.off = (int)*(ushort *)(lVar1 + 0x20000 + (ulong)(matchPtr_4._4_4_ & 0xffff) * 2);
          matchPtr_4._4_4_ = matchPtr_4._4_4_ - match.off;
          srcPatternLength._4_4_ = srcPatternLength._4_4_ - match.off;
        }
      }
      local_3dc = local_224;
      if (3 < local_224) {
        if ((favorDecSpeed != favorCompressionRatio) && (0x12 < local_224 && local_224 < 0x25)) {
          local_3dc = 0x12;
        }
        iStack_3a0 = local_3dc;
        local_3a4 = iVar20 - iStack_3d8;
      }
      ovref._4_4_ = iStack_3a0;
      if (iStack_3a0 == 0) {
        anchor = anchor + 1;
        goto LAB_00175c7c;
      }
      if ((ulong)(long)iStack_3a0 <= sufficient_len) {
        for (mlen = 0; mlen < 4; mlen = mlen + 1) {
          price_3 = iVar10 + mlen;
          if (0xe < price_3) {
            price_3 = (price_3 + -0xf) / 0xff + 1 + price_3;
          }
          pBVar28 = ip + (long)mlen * 0x10 + 8;
          pBVar28[0] = '\x01';
          pBVar28[1] = '\0';
          pBVar28[2] = '\0';
          pBVar28[3] = '\0';
          pBVar28 = ip + (long)mlen * 0x10 + 4;
          pBVar28[0] = '\0';
          pBVar28[1] = '\0';
          pBVar28[2] = '\0';
          pBVar28[3] = '\0';
          *(int *)(ip + (long)mlen * 0x10 + 0xc) = iVar10 + mlen;
          *(int *)(ip + (long)mlen * 0x10) = price_3;
        }
        for (offset = 4; offset <= iStack_3a0; offset = offset + 1) {
          local_10 = iVar10;
          if (0xe < iVar10) {
            local_10 = (iVar10 + -0xf) / 0xff + 1 + iVar10;
          }
          price_9 = local_10 + 3;
          if (0x12 < offset) {
            price_9 = (offset + -0x13) / 0xff + 1 + price_9;
          }
          *(int *)(ip + (long)offset * 0x10 + 8) = offset;
          *(int *)(ip + (long)offset * 0x10 + 4) = local_3a4;
          *(int *)(ip + (long)offset * 0x10 + 0xc) = iVar10;
          *(int *)(ip + (long)offset * 0x10) = price_9;
        }
        firstMatch.off = iStack_3a0;
        for (curPtr._4_4_ = 1; curPtr._4_4_ < 4; curPtr._4_4_ = curPtr._4_4_ + 1) {
          pBVar28 = ip + (long)(iStack_3a0 + curPtr._4_4_) * 0x10 + 8;
          pBVar28[0] = '\x01';
          pBVar28[1] = '\0';
          pBVar28[2] = '\0';
          pBVar28[3] = '\0';
          pBVar28 = ip + (long)(iStack_3a0 + curPtr._4_4_) * 0x10 + 4;
          pBVar28[0] = '\0';
          pBVar28[1] = '\0';
          pBVar28[2] = '\0';
          pBVar28[3] = '\0';
          *(int *)(ip + (long)(iStack_3a0 + curPtr._4_4_) * 0x10 + 0xc) = curPtr._4_4_;
          price_5 = curPtr._4_4_;
          if (0xe < curPtr._4_4_) {
            price_5 = (curPtr._4_4_ + -0xf) / 0xff + 1 + curPtr._4_4_;
          }
          *(int *)(ip + (long)(iStack_3a0 + curPtr._4_4_) * 0x10) =
               *(int *)(ip + (long)iStack_3a0 * 0x10) + price_5;
        }
        for (firstMatch.len = 1;
            (pcVar5 = source_local, pattern_1 = local_c80, pBVar28 = op,
            firstMatch.len < firstMatch.off &&
            (pBVar23 = anchor + firstMatch.len, pBVar23 <= matchlimit));
            firstMatch.len = firstMatch.len + 1) {
          if (fullUpdate == 0) {
            if (*(int *)(ip + (long)firstMatch.len * 0x10) <
                *(int *)(ip + (long)(firstMatch.len + 1) * 0x10)) goto LAB_00178419;
          }
          else if ((*(int *)(ip + (long)firstMatch.len * 0x10) <
                    *(int *)(ip + (long)(firstMatch.len + 1) * 0x10)) ||
                  (*(int *)(ip + (long)firstMatch.len * 0x10) + 3 <=
                   *(int *)(ip + (long)(firstMatch.len + 4) * 0x10))) {
LAB_00178419:
            if (fullUpdate == 0) {
              local_aa4 = firstMatch.off - firstMatch.len;
              local_a90 = source_local;
              local_aa0 = op;
              local_aa8 = local_c80;
              matchPtr_10._4_4_ = dict;
              matchPtr_10._0_4_ = favorDecSpeed;
              local_a98 = pBVar23;
              memset(&local_a84,0,8);
              pcVar5 = local_a90;
              pBVar23 = local_a98;
              pBVar28 = local_aa0;
              dVar7 = matchPtr_10._4_4_;
              HVar6 = (HCfavor_e)matchPtr_10;
              pvStack_ab8 = (void *)0x0;
              local_904 = local_aa4;
              lVar1 = *(long *)(local_a90 + 0x40028);
              lVar2 = *(long *)(local_a90 + 0x40008);
              uVar17 = *(uint *)(local_a90 + 0x40018);
              pBVar21 = (BYTE *)(lVar2 + (ulong)uVar17);
              iVar20 = (int)local_a98;
              uVar11 = iVar20 - (int)lVar2;
              if (uVar11 < *(int *)(local_a90 + 0x4001c) + 0x10000U) {
                local_fbc = *(uint *)(local_a90 + 0x4001c);
              }
              else {
                local_fbc = uVar11 - 0xffff;
              }
              lVar22 = *(long *)(local_a90 + 0x40010);
              pattern_2 = local_aa8;
              matchIndex_2 = 0;
              UVar12 = LZ4_read32(local_a98);
              srcPatternLength_2._0_4_ = 0;
              uStack_990 = 0;
              lVar3 = *(long *)(pcVar5 + 0x40008);
              uVar13 = iVar20 - (int)lVar3;
              for (local_8d0 = *(uint *)(pcVar5 + 0x40020); local_8d0 < uVar13;
                  local_8d0 = local_8d0 + 1) {
                UVar14 = LZ4HC_hashPtr((void *)(lVar3 + (ulong)local_8d0));
                uVar15 = local_8d0 - *(int *)(pcVar5 + (ulong)UVar14 * 4);
                if (0xffff < uVar15) {
                  uVar15 = 0xffff;
                }
                *(short *)(pcVar5 + (ulong)(local_8d0 & 0xffff) * 2 + 0x20000) = (short)uVar15;
                *(uint *)(pcVar5 + (ulong)UVar14 * 4) = local_8d0;
              }
              *(uint *)(pcVar5 + 0x40020) = uVar13;
              UVar14 = LZ4HC_hashPtr(pBVar23);
              srcPatternLength_2._4_4_ = *(uint *)(pcVar5 + (ulong)UVar14 * 4);
LAB_0017a72d:
              if (local_fbc <= srcPatternLength_2._4_4_ && 0 < (int)pattern_2) {
                matchPtr_11._4_4_ = 0;
                pattern_2 = pattern_2 - 1;
                if ((HVar6 == favorCompressionRatio) || (7 < uVar11 - srcPatternLength_2._4_4_)) {
                  if (srcPatternLength_2._4_4_ < uVar17) {
                    pvVar24 = (void *)(lVar22 + (ulong)srcPatternLength_2._4_4_);
                    UVar14 = LZ4_read32(pvVar24);
                    if (UVar14 != UVar12) goto LAB_0017b4dd;
                    _distanceToNextMatch_2 = pBVar23 + (uVar17 - srcPatternLength_2._4_4_);
                    if (pBVar28 < _distanceToNextMatch_2) {
                      _distanceToNextMatch_2 = pBVar28;
                    }
                    pBVar29 = pBVar23 + 4;
                    local_798 = (BYTE *)((long)pvVar24 + 4);
                    local_790 = pBVar29;
                    if (pBVar29 < _distanceToNextMatch_2 + -7) {
                      rVar25 = LZ4_read_ARCH(local_798);
                      rVar26 = LZ4_read_ARCH(pBVar29);
                      if ((rVar25 ^ rVar26) == 0) {
                        local_798 = (BYTE *)((long)pvVar24 + 0xc);
                        local_790 = pBVar23 + 0xc;
                        goto LAB_0017ae2a;
                      }
                      local_784 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                    }
                    else {
LAB_0017ae2a:
                      for (; local_790 < _distanceToNextMatch_2 + -7; local_790 = local_790 + 8) {
                        rVar25 = LZ4_read_ARCH(local_798);
                        rVar26 = LZ4_read_ARCH(local_790);
                        if ((rVar25 ^ rVar26) != 0) {
                          uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                          local_784 = ((int)local_790 + uVar13) - (int)pBVar29;
                          goto LAB_0017b010;
                        }
                        local_798 = local_798 + 8;
                      }
                      if (local_790 < _distanceToNextMatch_2 + -3) {
                        UVar14 = LZ4_read32(local_798);
                        UVar18 = LZ4_read32(local_790);
                        if (UVar14 == UVar18) {
                          local_790 = local_790 + 4;
                          local_798 = local_798 + 4;
                        }
                      }
                      if (local_790 < _distanceToNextMatch_2 + -1) {
                        UVar8 = LZ4_read16(local_798);
                        UVar9 = LZ4_read16(local_790);
                        if (UVar8 == UVar9) {
                          local_790 = local_790 + 2;
                          local_798 = local_798 + 2;
                        }
                      }
                      if ((local_790 < _distanceToNextMatch_2) && (*local_798 == *local_790)) {
                        local_790 = local_790 + 1;
                      }
                      local_784 = (int)local_790 - (int)pBVar29;
                    }
LAB_0017b010:
                    matchPtr_11._4_4_ = local_784 + 4;
                    if ((pBVar23 + matchPtr_11._4_4_ == _distanceToNextMatch_2) &&
                       (_distanceToNextMatch_2 < pBVar28)) {
                      pBVar29 = pBVar23 + matchPtr_11._4_4_;
                      local_7d0 = pBVar21;
                      local_7c8 = pBVar29;
                      if (pBVar29 < pBVar28 + -7) {
                        rVar25 = LZ4_read_ARCH(pBVar21);
                        rVar26 = LZ4_read_ARCH(pBVar29);
                        if ((rVar25 ^ rVar26) == 0) {
                          local_7d0 = pBVar21 + 8;
                          local_7c8 = pBVar29 + 8;
                          goto LAB_0017b12d;
                        }
                        local_7bc = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                      }
                      else {
LAB_0017b12d:
                        for (; local_7c8 < pBVar28 + -7; local_7c8 = local_7c8 + 8) {
                          rVar25 = LZ4_read_ARCH(local_7d0);
                          rVar26 = LZ4_read_ARCH(local_7c8);
                          if ((rVar25 ^ rVar26) != 0) {
                            uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                            local_7bc = ((int)local_7c8 + uVar13) - (int)pBVar29;
                            goto LAB_0017b313;
                          }
                          local_7d0 = local_7d0 + 8;
                        }
                        if (local_7c8 < pBVar28 + -3) {
                          UVar14 = LZ4_read32(local_7d0);
                          UVar18 = LZ4_read32(local_7c8);
                          if (UVar14 == UVar18) {
                            local_7c8 = local_7c8 + 4;
                            local_7d0 = local_7d0 + 4;
                          }
                        }
                        if (local_7c8 < pBVar28 + -1) {
                          UVar8 = LZ4_read16(local_7d0);
                          UVar9 = LZ4_read16(local_7c8);
                          if (UVar8 == UVar9) {
                            local_7c8 = local_7c8 + 2;
                            local_7d0 = local_7d0 + 2;
                          }
                        }
                        if ((local_7c8 < pBVar28) && (*local_7d0 == *local_7c8)) {
                          local_7c8 = local_7c8 + 1;
                        }
                        local_7bc = (int)local_7c8 - (int)pBVar29;
                      }
LAB_0017b313:
                      matchPtr_11._4_4_ = local_7bc + matchPtr_11._4_4_;
                    }
                    if (local_904 < matchPtr_11._4_4_) {
                      pvStack_ab8 = (void *)(lVar2 + (ulong)srcPatternLength_2._4_4_);
                      local_a98 = pBVar23;
                      local_904 = matchPtr_11._4_4_;
                    }
                  }
                  else {
                    pvVar24 = (void *)(lVar2 + (ulong)srcPatternLength_2._4_4_);
                    UVar8 = LZ4_read16(pBVar23 + (long)local_904 + -1);
                    UVar9 = LZ4_read16((void *)((long)pvVar24 + (long)local_904 + -1));
                    if ((UVar8 != UVar9) || (UVar14 = LZ4_read32(pvVar24), UVar14 != UVar12))
                    goto LAB_0017b4dd;
                    pBVar29 = pBVar23 + 4;
                    local_808 = (BYTE *)((long)pvVar24 + 4);
                    local_800 = pBVar29;
                    if (pBVar29 < pBVar28 + -7) {
                      rVar25 = LZ4_read_ARCH(local_808);
                      rVar26 = LZ4_read_ARCH(pBVar29);
                      if ((rVar25 ^ rVar26) == 0) {
                        local_808 = (BYTE *)((long)pvVar24 + 0xc);
                        local_800 = pBVar23 + 0xc;
                        goto LAB_0017aa5a;
                      }
                      local_7f4 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                    }
                    else {
LAB_0017aa5a:
                      for (; local_800 < pBVar28 + -7; local_800 = local_800 + 8) {
                        rVar25 = LZ4_read_ARCH(local_808);
                        rVar26 = LZ4_read_ARCH(local_800);
                        if ((rVar25 ^ rVar26) != 0) {
                          uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                          local_7f4 = ((int)local_800 + uVar13) - (int)pBVar29;
                          goto LAB_0017ac40;
                        }
                        local_808 = local_808 + 8;
                      }
                      if (local_800 < pBVar28 + -3) {
                        UVar14 = LZ4_read32(local_808);
                        UVar18 = LZ4_read32(local_800);
                        if (UVar14 == UVar18) {
                          local_800 = local_800 + 4;
                          local_808 = local_808 + 4;
                        }
                      }
                      if (local_800 < pBVar28 + -1) {
                        UVar8 = LZ4_read16(local_808);
                        UVar9 = LZ4_read16(local_800);
                        if (UVar8 == UVar9) {
                          local_800 = local_800 + 2;
                          local_808 = local_808 + 2;
                        }
                      }
                      if ((local_800 < pBVar28) && (*local_808 == *local_800)) {
                        local_800 = local_800 + 1;
                      }
                      local_7f4 = (int)local_800 - (int)pBVar29;
                    }
LAB_0017ac40:
                    matchPtr_11._4_4_ = local_7f4 + 4;
                    if (local_904 < matchPtr_11._4_4_) {
                      pvStack_ab8 = pvVar24;
                      local_a98 = pBVar23;
                      local_904 = matchPtr_11._4_4_;
                    }
                  }
                }
LAB_0017b4dd:
                if ((matchPtr_11._4_4_ == local_904) &&
                   (srcPatternLength_2._4_4_ + local_904 <= uVar11)) {
                  step_2 = 1;
                  candidateDist_2 = 0x10;
                  for (distNextMatch_2 = 0; (int)distNextMatch_2 < local_904 + -3;
                      distNextMatch_2 = iVar20 + distNextMatch_2) {
                    iVar20 = (int)candidateDist_2 >> 4;
                    candidateDist_2 = candidateDist_2 + 1;
                    if ((uint)step_2 <
                        (uint)*(ushort *)
                               (pcVar5 + (ulong)(srcPatternLength_2._4_4_ + distNextMatch_2 & 0xffff
                                                ) * 2 + 0x20000)) {
                      matchIndex_2 = distNextMatch_2;
                      candidateDist_2 = 0x10;
                      step_2 = (uint)*(ushort *)
                                      (pcVar5 + (ulong)(srcPatternLength_2._4_4_ + distNextMatch_2 &
                                                       0xffff) * 2 + 0x20000);
                    }
                  }
                  if ((uint)step_2 < 2) goto LAB_0017b624;
                  if (srcPatternLength_2._4_4_ < (uint)step_2) goto LAB_0017bbde;
                  srcPatternLength_2._4_4_ = srcPatternLength_2._4_4_ - step_2;
                }
                else {
LAB_0017b624:
                  if ((*(short *)(pcVar5 + (ulong)(srcPatternLength_2._4_4_ & 0xffff) * 2 + 0x20000)
                       == 1) && (matchIndex_2 == 0)) {
                    uVar13 = srcPatternLength_2._4_4_ - 1;
                    if ((int)srcPatternLength_2 == 0) {
                      if ((UVar12 & 0xffff) == UVar12 >> 0x10 && (UVar12 & 0xff) == UVar12 >> 0x18)
                      {
                        srcPatternLength_2._0_4_ = 2;
                        uVar15 = LZ4HC_countPattern(pBVar23 + 4,pBVar28,UVar12);
                        uStack_990 = (ulong)uVar15 + 4;
                      }
                      else {
                        srcPatternLength_2._0_4_ = 1;
                      }
                    }
                    if ((((int)srcPatternLength_2 == 2) && (local_fbc <= uVar13)) &&
                       (iVar20 = LZ4HC_protectDictEnd(uVar17,uVar13), iVar20 != 0)) {
                      bVar30 = uVar13 < uVar17;
                      local_1040 = lVar2;
                      if (bVar30) {
                        local_1040 = lVar22;
                      }
                      pBVar29 = (BYTE *)(local_1040 + (ulong)uVar13);
                      UVar14 = LZ4_read32(pBVar29);
                      if (UVar14 == UVar12) {
                        uVar15 = *(uint *)(pcVar5 + 0x4001c);
                        if (bVar30) {
                          local_1048 = (BYTE *)(lVar22 + (ulong)uVar17);
                        }
                        else {
                          local_1048 = pBVar28;
                        }
                        uVar16 = LZ4HC_countPattern(pBVar29 + 4,local_1048,UVar12);
                        sStack_a10 = (ulong)uVar16 + 4;
                        if ((bVar30) && (pBVar29 + sStack_a10 == local_1048)) {
                          UVar14 = LZ4HC_rotatePattern(sStack_a10,UVar12);
                          uVar16 = LZ4HC_countPattern(pBVar21,pBVar28,UVar14);
                          sStack_a10 = uVar16 + sStack_a10;
                        }
                        local_1050 = pBVar21;
                        if (bVar30) {
                          local_1050 = (BYTE *)(lVar22 + (ulong)uVar15);
                        }
                        currentSegmentLength_2._0_4_ =
                             LZ4HC_reverseCountPattern(pBVar29,local_1050,UVar12);
                        if (((!bVar30) &&
                            (pBVar29 + -(ulong)(uint)currentSegmentLength_2 == pBVar21)) &&
                           (*(uint *)(pcVar5 + 0x4001c) < uVar17)) {
                          UVar14 = LZ4HC_rotatePattern((ulong)-(uint)currentSegmentLength_2,UVar12);
                          uVar15 = LZ4HC_reverseCountPattern
                                             ((BYTE *)(lVar22 + (ulong)uVar17),
                                              (BYTE *)(lVar22 + (ulong)uVar15),UVar14);
                          currentSegmentLength_2._0_4_ = uVar15 + (uint)currentSegmentLength_2;
                        }
                        if (local_fbc < uVar13 - (uint)currentSegmentLength_2) {
                          local_1058 = uVar13 - (uint)currentSegmentLength_2;
                        }
                        else {
                          local_1058 = local_fbc;
                        }
                        local_1060 = (uVar13 - local_1058) + sStack_a10;
                        srcPatternLength_2._4_4_ = uVar17;
                        if ((local_1060 < uStack_990) || (uStack_990 < sStack_a10)) {
                          uVar13 = uVar13 - (uVar13 - local_1058);
                          iVar20 = LZ4HC_protectDictEnd(uVar17,uVar13);
                          if (iVar20 != 0) {
                            if (uStack_990 <= local_1060) {
                              local_1060 = uStack_990;
                            }
                            if ((ulong)(long)local_904 < local_1060) {
                              if ((BYTE *)0xffff < pBVar23 + (-(ulong)uVar13 - lVar2))
                              goto LAB_0017bbde;
                              local_904 = (int)local_1060;
                              pvStack_ab8 = (void *)(lVar2 + (ulong)uVar13);
                              local_a98 = pBVar23;
                            }
                            if (uVar13 < *(ushort *)
                                          (pcVar5 + (ulong)(uVar13 & 0xffff) * 2 + 0x20000))
                            goto LAB_0017bbde;
                            srcPatternLength_2._4_4_ =
                                 uVar13 - *(ushort *)
                                           (pcVar5 + (ulong)(uVar13 & 0xffff) * 2 + 0x20000);
                          }
                        }
                        else {
                          UVar14 = (uVar13 + (int)sStack_a10) - (int)uStack_990;
                          iVar20 = LZ4HC_protectDictEnd(uVar17,UVar14);
                          if (iVar20 != 0) {
                            srcPatternLength_2._4_4_ = UVar14;
                          }
                        }
                        goto LAB_0017a72d;
                      }
                    }
                  }
                  srcPatternLength_2._4_4_ =
                       srcPatternLength_2._4_4_ -
                       *(ushort *)
                        (pcVar5 + (ulong)(srcPatternLength_2._4_4_ + matchIndex_2 & 0xffff) * 2 +
                                  0x20000);
                }
                goto LAB_0017a72d;
              }
LAB_0017bbde:
              if (((dVar7 == usingDictCtxHc) && (0 < (int)pattern_2)) &&
                 (uVar11 - local_fbc < 0xffff)) {
                lVar22 = *(long *)(lVar1 + 0x40000) - *(long *)(lVar1 + 0x40008);
                UVar14 = LZ4HC_hashPtr(pBVar23);
                matchPtr_14._4_4_ = *(uint *)(lVar1 + (ulong)UVar14 * 4);
                srcPatternLength_2._4_4_ = (matchPtr_14._4_4_ + local_fbc) - (int)lVar22;
                while( true ) {
                  UVar14 = pattern_2;
                  bVar30 = uVar11 - srcPatternLength_2._4_4_ < 0x10000;
                  if (bVar30) {
                    pattern_2 = pattern_2 - 1;
                  }
                  if (!bVar30 || UVar14 == 0) break;
                  pvVar24 = (void *)(*(long *)(lVar1 + 0x40008) + (ulong)matchPtr_14._4_4_);
                  UVar14 = LZ4_read32(pvVar24);
                  if (UVar14 == UVar12) {
                    register0x00000000 = pBVar23 + (lVar22 - (ulong)matchPtr_14._4_4_);
                    if (pBVar28 < register0x00000000) {
                      stack0xfffffffffffff588 = pBVar28;
                    }
                    pBVar21 = stack0xfffffffffffff588;
                    pBVar29 = pBVar23 + 4;
                    local_760 = (BYTE *)((long)pvVar24 + 4);
                    local_758 = pBVar29;
                    if (pBVar29 < stack0xfffffffffffff588 + -7) {
                      rVar25 = LZ4_read_ARCH(local_760);
                      rVar26 = LZ4_read_ARCH(pBVar29);
                      if ((rVar25 ^ rVar26) == 0) {
                        local_760 = (BYTE *)((long)pvVar24 + 0xc);
                        local_758 = pBVar23 + 0xc;
                        goto LAB_0017be1f;
                      }
                      local_750 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                    }
                    else {
LAB_0017be1f:
                      for (; local_758 < pBVar21 + -7; local_758 = local_758 + 8) {
                        rVar25 = LZ4_read_ARCH(local_760);
                        rVar26 = LZ4_read_ARCH(local_758);
                        if ((rVar25 ^ rVar26) != 0) {
                          uVar17 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                          local_750 = ((int)local_758 + uVar17) - (int)pBVar29;
                          goto LAB_0017c005;
                        }
                        local_760 = local_760 + 8;
                      }
                      if (local_758 < pBVar21 + -3) {
                        UVar14 = LZ4_read32(local_760);
                        UVar18 = LZ4_read32(local_758);
                        if (UVar14 == UVar18) {
                          local_758 = local_758 + 4;
                          local_760 = local_760 + 4;
                        }
                      }
                      if (local_758 < pBVar21 + -1) {
                        UVar8 = LZ4_read16(local_760);
                        UVar9 = LZ4_read16(local_758);
                        if (UVar8 == UVar9) {
                          local_758 = local_758 + 2;
                          local_760 = local_760 + 2;
                        }
                      }
                      if ((local_758 < pBVar21) && (*local_760 == *local_758)) {
                        local_758 = local_758 + 1;
                      }
                      local_750 = (int)local_758 - (int)pBVar29;
                    }
LAB_0017c005:
                    if (local_904 < (int)(local_750 + 4)) {
                      pvStack_ab8 = (void *)(lVar2 + (ulong)srcPatternLength_2._4_4_);
                      local_a98 = pBVar23;
                      local_904 = local_750 + 4;
                    }
                  }
                  match_2.off = (int)*(ushort *)
                                      (lVar1 + 0x20000 + (ulong)(matchPtr_14._4_4_ & 0xffff) * 2);
                  matchPtr_14._4_4_ = matchPtr_14._4_4_ - match_2.off;
                  srcPatternLength_2._4_4_ = srcPatternLength_2._4_4_ - match_2.off;
                }
              }
              local_abc = local_904;
              if (local_aa4 < local_904) {
                if (((HCfavor_e)matchPtr_10 != favorCompressionRatio) &&
                   (0x12 < local_904 && local_904 < 0x25)) {
                  local_abc = 0x12;
                }
                iStack_a80 = local_abc;
                local_a84 = (int)local_a98 - (int)pvStack_ab8;
              }
              local_d38 = local_a84;
              iStack_d34 = iStack_a80;
            }
            else {
              memset(&local_714,0,8);
              _iStack_748 = (void *)0x0;
              local_594 = 3;
              lVar1 = *(long *)(pcVar5 + 0x40028);
              lVar2 = *(long *)(pcVar5 + 0x40008);
              uVar17 = *(uint *)(pcVar5 + 0x40018);
              pBVar21 = (BYTE *)(lVar2 + (ulong)uVar17);
              iVar20 = (int)pBVar23;
              uVar11 = iVar20 - (int)lVar2;
              if (uVar11 < *(int *)(pcVar5 + 0x4001c) + 0x10000U) {
                local_ee0 = *(uint *)(pcVar5 + 0x4001c);
              }
              else {
                local_ee0 = uVar11 - 0xffff;
              }
              lVar22 = *(long *)(pcVar5 + 0x40010);
              matchIndex_1 = 0;
              UVar12 = LZ4_read32(pBVar23);
              srcPatternLength_1._0_4_ = 0;
              uStack_620 = 0;
              lVar3 = *(long *)(pcVar5 + 0x40008);
              uVar13 = iVar20 - (int)lVar3;
              for (local_560 = *(uint *)(pcVar5 + 0x40020); local_560 < uVar13;
                  local_560 = local_560 + 1) {
                UVar14 = LZ4HC_hashPtr((void *)(lVar3 + (ulong)local_560));
                uVar15 = local_560 - *(int *)(pcVar5 + (ulong)UVar14 * 4);
                if (0xffff < uVar15) {
                  uVar15 = 0xffff;
                }
                *(short *)(pcVar5 + (ulong)(local_560 & 0xffff) * 2 + 0x20000) = (short)uVar15;
                *(uint *)(pcVar5 + (ulong)UVar14 * 4) = local_560;
              }
              *(uint *)(pcVar5 + 0x40020) = uVar13;
              UVar14 = LZ4HC_hashPtr(pBVar23);
              srcPatternLength_1._4_4_ = *(uint *)(pcVar5 + (ulong)UVar14 * 4);
LAB_001787d7:
              if (local_ee0 <= srcPatternLength_1._4_4_ && 0 < (int)pattern_1) {
                matchPtr_6._4_4_ = 0;
                pattern_1 = pattern_1 - 1;
                if ((favorDecSpeed == favorCompressionRatio) ||
                   (7 < uVar11 - srcPatternLength_1._4_4_)) {
                  if (srcPatternLength_1._4_4_ < uVar17) {
                    pvVar24 = (void *)(lVar22 + (ulong)srcPatternLength_1._4_4_);
                    UVar14 = LZ4_read32(pvVar24);
                    if (UVar14 != UVar12) goto LAB_00179587;
                    _distanceToNextMatch_1 = pBVar23 + (uVar17 - srcPatternLength_1._4_4_);
                    if (pBVar28 < _distanceToNextMatch_1) {
                      _distanceToNextMatch_1 = pBVar28;
                    }
                    pBVar29 = pBVar23 + 4;
                    local_428 = (BYTE *)((long)pvVar24 + 4);
                    local_420 = pBVar29;
                    if (pBVar29 < _distanceToNextMatch_1 + -7) {
                      rVar25 = LZ4_read_ARCH(local_428);
                      rVar26 = LZ4_read_ARCH(pBVar29);
                      if ((rVar25 ^ rVar26) == 0) {
                        local_428 = (BYTE *)((long)pvVar24 + 0xc);
                        local_420 = pBVar23 + 0xc;
                        goto LAB_00178ed4;
                      }
                      local_414 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                    }
                    else {
LAB_00178ed4:
                      for (; local_420 < _distanceToNextMatch_1 + -7; local_420 = local_420 + 8) {
                        rVar25 = LZ4_read_ARCH(local_428);
                        rVar26 = LZ4_read_ARCH(local_420);
                        if ((rVar25 ^ rVar26) != 0) {
                          uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                          local_414 = ((int)local_420 + uVar13) - (int)pBVar29;
                          goto LAB_001790ba;
                        }
                        local_428 = local_428 + 8;
                      }
                      if (local_420 < _distanceToNextMatch_1 + -3) {
                        UVar14 = LZ4_read32(local_428);
                        UVar18 = LZ4_read32(local_420);
                        if (UVar14 == UVar18) {
                          local_420 = local_420 + 4;
                          local_428 = local_428 + 4;
                        }
                      }
                      if (local_420 < _distanceToNextMatch_1 + -1) {
                        UVar8 = LZ4_read16(local_428);
                        UVar9 = LZ4_read16(local_420);
                        if (UVar8 == UVar9) {
                          local_420 = local_420 + 2;
                          local_428 = local_428 + 2;
                        }
                      }
                      if ((local_420 < _distanceToNextMatch_1) && (*local_428 == *local_420)) {
                        local_420 = local_420 + 1;
                      }
                      local_414 = (int)local_420 - (int)pBVar29;
                    }
LAB_001790ba:
                    matchPtr_6._4_4_ = local_414 + 4;
                    if ((pBVar23 + matchPtr_6._4_4_ == _distanceToNextMatch_1) &&
                       (_distanceToNextMatch_1 < pBVar28)) {
                      pBVar29 = pBVar23 + matchPtr_6._4_4_;
                      local_460 = pBVar21;
                      local_458 = pBVar29;
                      if (pBVar29 < pBVar28 + -7) {
                        rVar25 = LZ4_read_ARCH(pBVar21);
                        rVar26 = LZ4_read_ARCH(pBVar29);
                        if ((rVar25 ^ rVar26) == 0) {
                          local_460 = pBVar21 + 8;
                          local_458 = pBVar29 + 8;
                          goto LAB_001791d7;
                        }
                        local_44c = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                      }
                      else {
LAB_001791d7:
                        for (; local_458 < pBVar28 + -7; local_458 = local_458 + 8) {
                          rVar25 = LZ4_read_ARCH(local_460);
                          rVar26 = LZ4_read_ARCH(local_458);
                          if ((rVar25 ^ rVar26) != 0) {
                            uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                            local_44c = ((int)local_458 + uVar13) - (int)pBVar29;
                            goto LAB_001793bd;
                          }
                          local_460 = local_460 + 8;
                        }
                        if (local_458 < pBVar28 + -3) {
                          UVar14 = LZ4_read32(local_460);
                          UVar18 = LZ4_read32(local_458);
                          if (UVar14 == UVar18) {
                            local_458 = local_458 + 4;
                            local_460 = local_460 + 4;
                          }
                        }
                        if (local_458 < pBVar28 + -1) {
                          UVar8 = LZ4_read16(local_460);
                          UVar9 = LZ4_read16(local_458);
                          if (UVar8 == UVar9) {
                            local_458 = local_458 + 2;
                            local_460 = local_460 + 2;
                          }
                        }
                        if ((local_458 < pBVar28) && (*local_460 == *local_458)) {
                          local_458 = local_458 + 1;
                        }
                        local_44c = (int)local_458 - (int)pBVar29;
                      }
LAB_001793bd:
                      matchPtr_6._4_4_ = local_44c + matchPtr_6._4_4_;
                    }
                    if (local_594 < matchPtr_6._4_4_) {
                      _iStack_748 = (void *)(lVar2 + (ulong)srcPatternLength_1._4_4_);
                      local_594 = matchPtr_6._4_4_;
                    }
                  }
                  else {
                    pvVar24 = (void *)(lVar2 + (ulong)srcPatternLength_1._4_4_);
                    UVar8 = LZ4_read16(pBVar23 + (long)local_594 + -1);
                    UVar9 = LZ4_read16((void *)((long)pvVar24 + (long)local_594 + -1));
                    if ((UVar8 != UVar9) || (UVar14 = LZ4_read32(pvVar24), UVar14 != UVar12))
                    goto LAB_00179587;
                    pBVar29 = pBVar23 + 4;
                    local_498 = (BYTE *)((long)pvVar24 + 4);
                    local_490 = pBVar29;
                    if (pBVar29 < pBVar28 + -7) {
                      rVar25 = LZ4_read_ARCH(local_498);
                      rVar26 = LZ4_read_ARCH(pBVar29);
                      if ((rVar25 ^ rVar26) == 0) {
                        local_498 = (BYTE *)((long)pvVar24 + 0xc);
                        local_490 = pBVar23 + 0xc;
                        goto LAB_00178b04;
                      }
                      local_484 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                    }
                    else {
LAB_00178b04:
                      for (; local_490 < pBVar28 + -7; local_490 = local_490 + 8) {
                        rVar25 = LZ4_read_ARCH(local_498);
                        rVar26 = LZ4_read_ARCH(local_490);
                        if ((rVar25 ^ rVar26) != 0) {
                          uVar13 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                          local_484 = ((int)local_490 + uVar13) - (int)pBVar29;
                          goto LAB_00178cea;
                        }
                        local_498 = local_498 + 8;
                      }
                      if (local_490 < pBVar28 + -3) {
                        UVar14 = LZ4_read32(local_498);
                        UVar18 = LZ4_read32(local_490);
                        if (UVar14 == UVar18) {
                          local_490 = local_490 + 4;
                          local_498 = local_498 + 4;
                        }
                      }
                      if (local_490 < pBVar28 + -1) {
                        UVar8 = LZ4_read16(local_498);
                        UVar9 = LZ4_read16(local_490);
                        if (UVar8 == UVar9) {
                          local_490 = local_490 + 2;
                          local_498 = local_498 + 2;
                        }
                      }
                      if ((local_490 < pBVar28) && (*local_498 == *local_490)) {
                        local_490 = local_490 + 1;
                      }
                      local_484 = (int)local_490 - (int)pBVar29;
                    }
LAB_00178cea:
                    matchPtr_6._4_4_ = local_484 + 4;
                    if (local_594 < matchPtr_6._4_4_) {
                      _iStack_748 = pvVar24;
                      local_594 = matchPtr_6._4_4_;
                    }
                  }
                }
LAB_00179587:
                if ((matchPtr_6._4_4_ == local_594) &&
                   (srcPatternLength_1._4_4_ + local_594 <= uVar11)) {
                  step_1 = 1;
                  candidateDist_1 = 0x10;
                  for (distNextMatch_1 = 0; (int)distNextMatch_1 < local_594 + -3;
                      distNextMatch_1 = iVar10 + distNextMatch_1) {
                    iVar10 = (int)candidateDist_1 >> 4;
                    candidateDist_1 = candidateDist_1 + 1;
                    if ((uint)step_1 <
                        (uint)*(ushort *)
                               (pcVar5 + (ulong)(srcPatternLength_1._4_4_ + distNextMatch_1 & 0xffff
                                                ) * 2 + 0x20000)) {
                      matchIndex_1 = distNextMatch_1;
                      candidateDist_1 = 0x10;
                      step_1 = (uint)*(ushort *)
                                      (pcVar5 + (ulong)(srcPatternLength_1._4_4_ + distNextMatch_1 &
                                                       0xffff) * 2 + 0x20000);
                    }
                  }
                  if ((uint)step_1 < 2) goto LAB_001796ce;
                  if (srcPatternLength_1._4_4_ < (uint)step_1) goto LAB_00179c88;
                  srcPatternLength_1._4_4_ = srcPatternLength_1._4_4_ - step_1;
                }
                else {
LAB_001796ce:
                  if ((*(short *)(pcVar5 + (ulong)(srcPatternLength_1._4_4_ & 0xffff) * 2 + 0x20000)
                       == 1) && (matchIndex_1 == 0)) {
                    uVar13 = srcPatternLength_1._4_4_ - 1;
                    if ((int)srcPatternLength_1 == 0) {
                      if ((UVar12 & 0xffff) == UVar12 >> 0x10 && (UVar12 & 0xff) == UVar12 >> 0x18)
                      {
                        srcPatternLength_1._0_4_ = 2;
                        uVar15 = LZ4HC_countPattern(pBVar23 + 4,pBVar28,UVar12);
                        uStack_620 = (ulong)uVar15 + 4;
                      }
                      else {
                        srcPatternLength_1._0_4_ = 1;
                      }
                    }
                    if ((((int)srcPatternLength_1 == 2) && (local_ee0 <= uVar13)) &&
                       (iVar10 = LZ4HC_protectDictEnd(uVar17,uVar13), iVar10 != 0)) {
                      bVar30 = uVar13 < uVar17;
                      local_f60 = lVar2;
                      if (bVar30) {
                        local_f60 = lVar22;
                      }
                      pBVar29 = (BYTE *)(local_f60 + (ulong)uVar13);
                      UVar14 = LZ4_read32(pBVar29);
                      if (UVar14 == UVar12) {
                        uVar15 = *(uint *)(pcVar5 + 0x4001c);
                        if (bVar30) {
                          local_f68 = (BYTE *)(lVar22 + (ulong)uVar17);
                        }
                        else {
                          local_f68 = pBVar28;
                        }
                        uVar16 = LZ4HC_countPattern(pBVar29 + 4,local_f68,UVar12);
                        sStack_6a0 = (ulong)uVar16 + 4;
                        if ((bVar30) && (pBVar29 + sStack_6a0 == local_f68)) {
                          UVar14 = LZ4HC_rotatePattern(sStack_6a0,UVar12);
                          uVar16 = LZ4HC_countPattern(pBVar21,pBVar28,UVar14);
                          sStack_6a0 = uVar16 + sStack_6a0;
                        }
                        local_f70 = pBVar21;
                        if (bVar30) {
                          local_f70 = (BYTE *)(lVar22 + (ulong)uVar15);
                        }
                        currentSegmentLength_1._0_4_ =
                             LZ4HC_reverseCountPattern(pBVar29,local_f70,UVar12);
                        if (((!bVar30) &&
                            (pBVar29 + -(ulong)(uint)currentSegmentLength_1 == pBVar21)) &&
                           (*(uint *)(pcVar5 + 0x4001c) < uVar17)) {
                          UVar14 = LZ4HC_rotatePattern((ulong)-(uint)currentSegmentLength_1,UVar12);
                          uVar15 = LZ4HC_reverseCountPattern
                                             ((BYTE *)(lVar22 + (ulong)uVar17),
                                              (BYTE *)(lVar22 + (ulong)uVar15),UVar14);
                          currentSegmentLength_1._0_4_ = uVar15 + (uint)currentSegmentLength_1;
                        }
                        if (local_ee0 < uVar13 - (uint)currentSegmentLength_1) {
                          local_f78 = uVar13 - (uint)currentSegmentLength_1;
                        }
                        else {
                          local_f78 = local_ee0;
                        }
                        local_f80 = (uVar13 - local_f78) + sStack_6a0;
                        srcPatternLength_1._4_4_ = uVar17;
                        if ((local_f80 < uStack_620) || (uStack_620 < sStack_6a0)) {
                          uVar13 = uVar13 - (uVar13 - local_f78);
                          iVar10 = LZ4HC_protectDictEnd(uVar17,uVar13);
                          if (iVar10 != 0) {
                            if (uStack_620 <= local_f80) {
                              local_f80 = uStack_620;
                            }
                            if ((ulong)(long)local_594 < local_f80) {
                              if ((BYTE *)0xffff < pBVar23 + (-(ulong)uVar13 - lVar2))
                              goto LAB_00179c88;
                              local_594 = (int)local_f80;
                              _iStack_748 = (void *)(lVar2 + (ulong)uVar13);
                            }
                            if (uVar13 < *(ushort *)
                                          (pcVar5 + (ulong)(uVar13 & 0xffff) * 2 + 0x20000))
                            goto LAB_00179c88;
                            srcPatternLength_1._4_4_ =
                                 uVar13 - *(ushort *)
                                           (pcVar5 + (ulong)(uVar13 & 0xffff) * 2 + 0x20000);
                          }
                        }
                        else {
                          UVar14 = (uVar13 + (int)sStack_6a0) - (int)uStack_620;
                          iVar10 = LZ4HC_protectDictEnd(uVar17,UVar14);
                          if (iVar10 != 0) {
                            srcPatternLength_1._4_4_ = UVar14;
                          }
                        }
                        goto LAB_001787d7;
                      }
                    }
                  }
                  srcPatternLength_1._4_4_ =
                       srcPatternLength_1._4_4_ -
                       *(ushort *)
                        (pcVar5 + (ulong)(srcPatternLength_1._4_4_ + matchIndex_1 & 0xffff) * 2 +
                                  0x20000);
                }
                goto LAB_001787d7;
              }
LAB_00179c88:
              if (((dict == usingDictCtxHc) && (0 < (int)pattern_1)) &&
                 (uVar11 - local_ee0 < 0xffff)) {
                lVar22 = *(long *)(lVar1 + 0x40000) - *(long *)(lVar1 + 0x40008);
                UVar14 = LZ4HC_hashPtr(pBVar23);
                matchPtr_9._4_4_ = *(uint *)(lVar1 + (ulong)UVar14 * 4);
                srcPatternLength_1._4_4_ = (matchPtr_9._4_4_ + local_ee0) - (int)lVar22;
                while( true ) {
                  UVar14 = pattern_1;
                  bVar30 = uVar11 - srcPatternLength_1._4_4_ < 0x10000;
                  if (bVar30) {
                    pattern_1 = pattern_1 - 1;
                  }
                  if (!bVar30 || UVar14 == 0) break;
                  pvVar24 = (void *)(*(long *)(lVar1 + 0x40008) + (ulong)matchPtr_9._4_4_);
                  UVar14 = LZ4_read32(pvVar24);
                  if (UVar14 == UVar12) {
                    register0x00000000 = pBVar23 + (lVar22 - (ulong)matchPtr_9._4_4_);
                    if (pBVar28 < register0x00000000) {
                      stack0xfffffffffffff8f8 = pBVar28;
                    }
                    pBVar21 = stack0xfffffffffffff8f8;
                    pBVar29 = pBVar23 + 4;
                    local_3f0 = (BYTE *)((long)pvVar24 + 4);
                    local_3e8 = pBVar29;
                    if (pBVar29 < stack0xfffffffffffff8f8 + -7) {
                      rVar25 = LZ4_read_ARCH(local_3f0);
                      rVar26 = LZ4_read_ARCH(pBVar29);
                      if ((rVar25 ^ rVar26) == 0) {
                        local_3f0 = (BYTE *)((long)pvVar24 + 0xc);
                        local_3e8 = pBVar23 + 0xc;
                        goto LAB_00179ec9;
                      }
                      local_3e0 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                    }
                    else {
LAB_00179ec9:
                      for (; local_3e8 < pBVar21 + -7; local_3e8 = local_3e8 + 8) {
                        rVar25 = LZ4_read_ARCH(local_3f0);
                        rVar26 = LZ4_read_ARCH(local_3e8);
                        if ((rVar25 ^ rVar26) != 0) {
                          uVar17 = LZ4_NbCommonBytes(rVar25 ^ rVar26);
                          local_3e0 = ((int)local_3e8 + uVar17) - (int)pBVar29;
                          goto LAB_0017a0af;
                        }
                        local_3f0 = local_3f0 + 8;
                      }
                      if (local_3e8 < pBVar21 + -3) {
                        UVar14 = LZ4_read32(local_3f0);
                        UVar18 = LZ4_read32(local_3e8);
                        if (UVar14 == UVar18) {
                          local_3e8 = local_3e8 + 4;
                          local_3f0 = local_3f0 + 4;
                        }
                      }
                      if (local_3e8 < pBVar21 + -1) {
                        UVar8 = LZ4_read16(local_3f0);
                        UVar9 = LZ4_read16(local_3e8);
                        if (UVar8 == UVar9) {
                          local_3e8 = local_3e8 + 2;
                          local_3f0 = local_3f0 + 2;
                        }
                      }
                      if ((local_3e8 < pBVar21) && (*local_3f0 == *local_3e8)) {
                        local_3e8 = local_3e8 + 1;
                      }
                      local_3e0 = (int)local_3e8 - (int)pBVar29;
                    }
LAB_0017a0af:
                    if (local_594 < (int)(local_3e0 + 4)) {
                      _iStack_748 = (void *)(lVar2 + (ulong)srcPatternLength_1._4_4_);
                      local_594 = local_3e0 + 4;
                    }
                  }
                  match_1.off = (int)*(ushort *)
                                      (lVar1 + 0x20000 + (ulong)(matchPtr_9._4_4_ & 0xffff) * 2);
                  matchPtr_9._4_4_ = matchPtr_9._4_4_ - match_1.off;
                  srcPatternLength_1._4_4_ = srcPatternLength_1._4_4_ - match_1.off;
                }
              }
              local_74c = local_594;
              if (3 < local_594) {
                if ((favorDecSpeed != favorCompressionRatio) &&
                   (0x12 < local_594 && local_594 < 0x25)) {
                  local_74c = 0x12;
                }
                iStack_710 = local_74c;
                local_714 = iVar20 - iStack_748;
              }
              local_d38 = local_714;
              iStack_d34 = iStack_710;
            }
            if (iStack_d34 != 0) {
              if ((sufficient_len < (ulong)(long)iStack_d34) ||
                 (0xfff < iStack_d34 + firstMatch.len)) {
                cur = iStack_d34;
                last_match_pos = local_d38;
                firstMatch.off = firstMatch.len + 1;
                goto LAB_0017c8ee;
              }
              iVar20 = *(int *)(ip + (long)firstMatch.len * 0x10 + 0xc);
              for (pos_3 = 1; pos_3 < 4; pos_3 = pos_3 + 1) {
                price_6 = iVar20;
                if (0xe < iVar20) {
                  price_6 = (iVar20 + -0xf) / 0xff + 1 + iVar20;
                }
                price_12 = iVar20 + pos_3;
                if (0xe < price_12) {
                  price_12 = (price_12 + -0xf) / 0xff + 1 + price_12;
                }
                iVar10 = (*(int *)(ip + (long)firstMatch.len * 0x10) - price_6) + price_12;
                iVar19 = firstMatch.len + pos_3;
                if (iVar10 < *(int *)(ip + (long)iVar19 * 0x10)) {
                  pBVar28 = ip + (long)iVar19 * 0x10 + 8;
                  pBVar28[0] = '\x01';
                  pBVar28[1] = '\0';
                  pBVar28[2] = '\0';
                  pBVar28[3] = '\0';
                  pBVar28 = ip + (long)iVar19 * 0x10 + 4;
                  pBVar28[0] = '\0';
                  pBVar28[1] = '\0';
                  pBVar28[2] = '\0';
                  pBVar28[3] = '\0';
                  *(int *)(ip + (long)iVar19 * 0x10 + 0xc) = iVar20 + pos_3;
                  *(int *)(ip + (long)iVar19 * 0x10) = iVar10;
                }
              }
              for (offset_1 = 4; offset_1 <= iStack_d34; offset_1 = offset_1 + 1) {
                iVar20 = firstMatch.len + offset_1;
                if (*(int *)(ip + (long)firstMatch.len * 0x10 + 8) == 1) {
                  candidate_pos = *(int *)(ip + (long)firstMatch.len * 0x10 + 0xc);
                  if (candidate_pos < firstMatch.len) {
                    local_10a4 = *(int *)(ip + (long)(firstMatch.len - candidate_pos) * 0x10);
                  }
                  else {
                    local_10a4 = 0;
                  }
                  local_24 = candidate_pos;
                  if (0xe < candidate_pos) {
                    local_24 = (candidate_pos + -0xf) / 0xff + 1 + candidate_pos;
                  }
                  price_11 = local_24 + 3;
                  if (0x12 < offset_1) {
                    price_11 = (offset_1 + -0x13) / 0xff + 1 + price_11;
                  }
                  addLit_1 = local_10a4 + price_11;
                }
                else {
                  candidate_pos = 0;
                  price = 3;
                  if (0x12 < offset_1) {
                    price = (offset_1 + -0x13) / 0xff + 4;
                  }
                  addLit_1 = *(int *)(ip + (long)firstMatch.len * 0x10) + price;
                }
                if ((firstMatch.off + 3 < iVar20) ||
                   (addLit_1 <= (int)(*(int *)(ip + (long)iVar20 * 0x10) - favorDecSpeed))) {
                  if ((offset_1 == iStack_d34) && (firstMatch.off < iVar20)) {
                    firstMatch.off = iVar20;
                  }
                  *(int *)(ip + (long)iVar20 * 0x10 + 8) = offset_1;
                  *(int *)(ip + (long)iVar20 * 0x10 + 4) = local_d38;
                  *(int *)(ip + (long)iVar20 * 0x10 + 0xc) = candidate_pos;
                  *(int *)(ip + (long)iVar20 * 0x10) = addLit_1;
                }
              }
              for (selected_matchLength = 1; selected_matchLength < 4;
                  selected_matchLength = selected_matchLength + 1) {
                pBVar28 = ip + (long)(firstMatch.off + selected_matchLength) * 0x10 + 8;
                pBVar28[0] = '\x01';
                pBVar28[1] = '\0';
                pBVar28[2] = '\0';
                pBVar28[3] = '\0';
                pBVar28 = ip + (long)(firstMatch.off + selected_matchLength) * 0x10 + 4;
                pBVar28[0] = '\0';
                pBVar28[1] = '\0';
                pBVar28[2] = '\0';
                pBVar28[3] = '\0';
                *(int *)(ip + (long)(firstMatch.off + selected_matchLength) * 0x10 + 0xc) =
                     selected_matchLength;
                local_6c = selected_matchLength;
                if (0xe < selected_matchLength) {
                  local_6c = (selected_matchLength + -0xf) / 0xff + 1 + selected_matchLength;
                }
                *(int *)(ip + (long)(firstMatch.off + selected_matchLength) * 0x10) =
                     *(int *)(ip + (long)firstMatch.off * 0x10) + local_6c;
              }
            }
          }
        }
        cur = *(int *)(ip + (long)firstMatch.off * 0x10 + 8);
        last_match_pos = *(int *)(ip + (long)firstMatch.off * 0x10 + 4);
        firstMatch.len = firstMatch.off - cur;
LAB_0017c8ee:
        selected_offset = firstMatch.len;
        next_matchLength = cur;
        next_offset = last_match_pos;
        while( true ) {
          iVar20 = *(int *)(ip + (long)selected_offset * 0x10 + 8);
          iVar10 = *(int *)(ip + (long)selected_offset * 0x10 + 4);
          *(int *)(ip + (long)selected_offset * 0x10 + 8) = next_matchLength;
          *(int *)(ip + (long)selected_offset * 0x10 + 4) = next_offset;
          if (selected_offset < iVar20) break;
          selected_offset = selected_offset - iVar20;
          next_offset = iVar10;
          next_matchLength = iVar20;
        }
        offset_2 = 0;
        while (offset_2 < firstMatch.off) {
          ovref._4_4_ = *(int *)(ip + (long)offset_2 * 0x10 + 8);
          iVar20 = *(int *)(ip + (long)offset_2 * 0x10 + 4);
          if (ovref._4_4_ == 1) {
            anchor = anchor + 1;
            offset_2 = offset_2 + 1;
          }
          else {
            offset_2 = ovref._4_4_ + offset_2;
            oend = opSaved;
            local_bd8 = (long)anchor - (long)iVar20;
            local_bb8 = &anchor;
            local_bc0 = &opSaved;
            local_bc8 = &iend;
            local_bdc = limit;
            length_1 = (size_t)pBStack_cd0;
            len_1 = (size_t)opSaved;
            pBVar28 = opSaved + 1;
            token_1 = anchor + -(long)iend;
            local_bcc = ovref._4_4_;
            if ((limit == notLimited) ||
               (pBVar28 + (ulong)token_1 / 0xff + (long)token_1 + 8 <= pBStack_cd0)) {
              if (token_1 < (BYTE *)0xf) {
                *opSaved = (char)token_1 * '\x10';
                opSaved = pBVar28;
              }
              else {
                *opSaved = 0xf0;
                opSaved = pBVar28;
                for (local_c00 = token_1 + -0xf; (BYTE *)0xfe < local_c00;
                    local_c00 = local_c00 + -0xff) {
                  pBVar28 = *local_bc0;
                  *local_bc0 = pBVar28 + 1;
                  *pBVar28 = 0xff;
                }
                BVar4 = (BYTE)local_c00;
                pBVar28 = *local_bc0;
                *local_bc0 = pBVar28 + 1;
                *pBVar28 = BVar4;
              }
              local_af8 = *local_bc0;
              local_b00 = *local_bc8;
              local_b20 = *local_bc0 + (long)token_1;
              e_1 = local_b00;
              s_1 = local_af8;
              do {
                *(undefined8 *)s_1 = *(undefined8 *)e_1;
                s_1 = s_1 + 8;
                e_1 = e_1 + 8;
              } while (s_1 < local_b20);
              d_1 = local_b20;
              *local_bc0 = token_1 + (long)*local_bc0;
              LZ4_writeLE16(*local_bc0,(short)*local_bb8 - (short)local_bd8);
              *local_bc0 = *local_bc0 + 2;
              token_1 = (BYTE *)((long)local_bcc - 4);
              if ((local_bdc == notLimited) || (*local_bc0 + (ulong)token_1 / 0xff + 6 <= length_1))
              {
                if (token_1 < (BYTE *)0xf) {
                  *(char *)len_1 = *(char *)len_1 + (char)token_1;
                }
                else {
                  *(char *)len_1 = *(char *)len_1 + '\x0f';
                  for (token_1 = (BYTE *)((long)local_bcc + -0x13); (BYTE *)0x1fd < token_1;
                      token_1 = token_1 + -0x1fe) {
                    pBVar28 = *local_bc0;
                    *local_bc0 = pBVar28 + 1;
                    *pBVar28 = 0xff;
                    pBVar28 = *local_bc0;
                    *local_bc0 = pBVar28 + 1;
                    *pBVar28 = 0xff;
                  }
                  if ((BYTE *)0xfe < token_1) {
                    token_1 = token_1 + -0xff;
                    pBVar28 = *local_bc0;
                    *local_bc0 = pBVar28 + 1;
                    *pBVar28 = 0xff;
                  }
                  BVar4 = (BYTE)token_1;
                  pBVar28 = *local_bc0;
                  *local_bc0 = pBVar28 + 1;
                  *pBVar28 = BVar4;
                }
                *local_bb8 = *local_bb8 + local_bcc;
                *local_bc8 = *local_bb8;
                local_bac = 0;
              }
              else {
                local_bac = 1;
              }
            }
            else {
              local_bac = 1;
              opSaved = pBVar28;
            }
            if (local_bac != 0) {
              _best_mlen = (long)anchor - (long)iVar20;
              goto LAB_0017d0ee;
            }
          }
        }
        goto LAB_00175c7c;
      }
      _best_mlen = (long)anchor - (long)local_3a4;
      oend = opSaved;
      local_b60 = &anchor;
      local_b68 = &opSaved;
      local_b70 = &iend;
      local_b74 = iStack_3a0;
      local_b84 = limit;
      length = (size_t)pBStack_cd0;
      len = (size_t)opSaved;
      pBVar28 = opSaved + 1;
      token = anchor + -(long)iend;
      local_b80 = _best_mlen;
      if ((limit == notLimited) || (pBVar28 + (ulong)token / 0xff + (long)token + 8 <= pBStack_cd0))
      {
        if (token < (BYTE *)0xf) {
          *opSaved = (char)token * '\x10';
          opSaved = pBVar28;
        }
        else {
          *opSaved = 0xf0;
          opSaved = pBVar28;
          for (local_ba8 = token + -0xf; (BYTE *)0xfe < local_ba8; local_ba8 = local_ba8 + -0xff) {
            pBVar28 = *local_b68;
            *local_b68 = pBVar28 + 1;
            *pBVar28 = 0xff;
          }
          BVar4 = (BYTE)local_ba8;
          pBVar28 = *local_b68;
          *local_b68 = pBVar28 + 1;
          *pBVar28 = BVar4;
        }
        local_b28 = *local_b68;
        local_b30 = *local_b70;
        local_b50 = *local_b68 + (long)token;
        e = local_b30;
        s = local_b28;
        do {
          *(undefined8 *)s = *(undefined8 *)e;
          s = s + 8;
          e = e + 8;
        } while (s < local_b50);
        d = local_b50;
        *local_b68 = token + (long)*local_b68;
        LZ4_writeLE16(*local_b68,(short)*local_b60 - (short)local_b80);
        *local_b68 = *local_b68 + 2;
        token = (BYTE *)((long)local_b74 - 4);
        if ((local_b84 == notLimited) || (*local_b68 + (ulong)token / 0xff + 6 <= length)) {
          if (token < (BYTE *)0xf) {
            *(char *)len = *(char *)len + (char)token;
          }
          else {
            *(char *)len = *(char *)len + '\x0f';
            for (token = (BYTE *)((long)local_b74 + -0x13); (BYTE *)0x1fd < token;
                token = token + -0x1fe) {
              pBVar28 = *local_b68;
              *local_b68 = pBVar28 + 1;
              *pBVar28 = 0xff;
              pBVar28 = *local_b68;
              *local_b68 = pBVar28 + 1;
              *pBVar28 = 0xff;
            }
            if ((BYTE *)0xfe < token) {
              token = token + -0xff;
              pBVar28 = *local_b68;
              *local_b68 = pBVar28 + 1;
              *pBVar28 = 0xff;
            }
            BVar4 = (BYTE)token;
            pBVar28 = *local_b68;
            *local_b68 = pBVar28 + 1;
            *pBVar28 = BVar4;
          }
          *local_b60 = *local_b60 + local_b74;
          *local_b70 = *local_b60;
          local_b54 = 0;
        }
        else {
          local_b54 = 1;
        }
      }
      else {
        local_b54 = 1;
        opSaved = pBVar28;
      }
    } while (local_b54 == 0);
LAB_0017d0ee:
    if (limit == fillOutput) {
      pBVar28 = anchor + (((ulong)(anchor + (0xf0 - (long)iend)) / 0xff + 1) - (long)iend);
      opSaved = oend;
      if (oend + (long)pBVar28 <= pBStack_cd0 + -3) {
        uVar27 = ((long)(pBStack_cd0 + -3) - (long)(oend + (long)pBVar28)) * 0xff + 0x12;
        if (uVar27 < (ulong)(long)ovref._4_4_) {
          ovref._4_4_ = (int)uVar27;
        }
        if (0xb < (long)(pBStack_cd0 + (long)ovref._4_4_ + (4 - (long)(oend + (long)(pBVar28 + 2))))
           ) {
          local_c10 = &anchor;
          local_c18 = &opSaved;
          local_c20 = &iend;
          local_c24 = ovref._4_4_;
          local_c30 = _best_mlen;
          local_c34 = 0;
          length_2 = (size_t)pBStack_cd0;
          len_2 = (size_t)oend;
          opSaved = oend + 1;
          token_2 = anchor + -(long)iend;
          if (token_2 < (BYTE *)0xf) {
            *oend = (char)token_2 * '\x10';
          }
          else {
            *oend = 0xf0;
            for (ctx_local = (LZ4HC_CCtx_internal *)(token_2 + -0xf);
                (LZ4HC_CCtx_internal *)0xfe < ctx_local;
                ctx_local = (LZ4HC_CCtx_internal *)((long)ctx_local[-1].chainTable + 0x1ff31)) {
              pBVar28 = *local_c18;
              *local_c18 = pBVar28 + 1;
              *pBVar28 = 0xff;
            }
            BVar4 = (BYTE)ctx_local;
            pBVar28 = *local_c18;
            *local_c18 = pBVar28 + 1;
            *pBVar28 = BVar4;
          }
          local_ac8 = *local_c18;
          local_ad0 = *local_c20;
          local_af0 = *local_c18 + (long)token_2;
          e_2 = local_ad0;
          s_2 = local_ac8;
          do {
            *(undefined8 *)s_2 = *(undefined8 *)e_2;
            s_2 = s_2 + 8;
            e_2 = e_2 + 8;
          } while (s_2 < local_af0);
          d_2 = local_af0;
          *local_c18 = token_2 + (long)*local_c18;
          LZ4_writeLE16(*local_c18,(short)*local_c10 - (short)local_c30);
          *local_c18 = *local_c18 + 2;
          token_2 = (BYTE *)((long)local_c24 - 4);
          if ((local_c34 == 0) || (*local_c18 + (ulong)token_2 / 0xff + 6 <= length_2)) {
            if (token_2 < (BYTE *)0xf) {
              *(char *)len_2 = *(char *)len_2 + (char)token_2;
            }
            else {
              *(char *)len_2 = *(char *)len_2 + '\x0f';
              for (token_2 = (BYTE *)((long)local_c24 + -0x13); (BYTE *)0x1fd < token_2;
                  token_2 = token_2 + -0x1fe) {
                pBVar28 = *local_c18;
                *local_c18 = pBVar28 + 1;
                *pBVar28 = 0xff;
                pBVar28 = *local_c18;
                *local_c18 = pBVar28 + 1;
                *pBVar28 = 0xff;
              }
              if ((BYTE *)0xfe < token_2) {
                token_2 = token_2 + -0xff;
                pBVar28 = *local_c18;
                *local_c18 = pBVar28 + 1;
                *pBVar28 = 0xff;
              }
              BVar4 = (BYTE)token_2;
              pBVar28 = *local_c18;
              *local_c18 = pBVar28 + 1;
              *pBVar28 = BVar4;
            }
            *local_c10 = *local_c10 + local_c24;
            *local_c20 = *local_c10;
            local_c04 = 0;
          }
          else {
            local_c04 = 1;
          }
        }
      }
LAB_0017cecc:
      llAdd = (long)mflimit - (long)iend;
      if (limit == fillOutput) {
        pBStack_cd0 = pBStack_cd0 + 5;
      }
      if ((limit != notLimited) && (pBStack_cd0 < opSaved + (llAdd + 0xf0) / 0xff + 1 + llAdd)) {
        if (limit == limitedOutput) {
          opt._4_4_ = 0;
          goto LAB_0017d621;
        }
        llAdd = (size_t)(pBStack_cd0 +
                        ((-1 - (long)opSaved) - ((ulong)(pBStack_cd0 + (0xf0 - (long)opSaved)) >> 8)
                        ));
      }
      anchor = iend + llAdd;
      if (llAdd < 0xf) {
        *opSaved = (BYTE)(llAdd << 4);
        opSaved = opSaved + 1;
      }
      else {
        ll_1 = llAdd - 0xf;
        *opSaved = 0xf0;
        pBVar28 = opSaved;
        for (; opSaved = pBVar28 + 1, 0xfe < ll_1; ll_1 = ll_1 - 0xff) {
          *opSaved = 0xff;
          pBVar28 = opSaved;
        }
        *opSaved = (BYTE)ll_1;
        opSaved = pBVar28 + 2;
      }
      memcpy(opSaved,iend,llAdd);
      opSaved = opSaved + llAdd;
      *_nbSearches_local = (int)anchor - (int)dst_local;
      opt._4_4_ = (int)opSaved - (int)srcSizePtr_local;
    }
  }
LAB_0017d621:
  free(ip);
  return opt._4_4_;
}

Assistant:

static int LZ4HC_compress_optimal ( LZ4HC_CCtx_internal* ctx,
                                    const char* const source,
                                    char* dst,
                                    int* srcSizePtr,
                                    int dstCapacity,
                                    int const nbSearches,
                                    size_t sufficient_len,
                                    const limitedOutput_directive limit,
                                    int const fullUpdate,
                                    const dictCtx_directive dict,
                                    const HCfavor_e favorDecSpeed)
{
    int retval = 0;
#define TRAILING_LITERALS 3
#ifdef LZ4HC_HEAPMODE
    LZ4HC_optimal_t* const opt = (LZ4HC_optimal_t*)ALLOC(sizeof(LZ4HC_optimal_t) * (LZ4_OPT_NUM + TRAILING_LITERALS));
#else
    LZ4HC_optimal_t opt[LZ4_OPT_NUM + TRAILING_LITERALS];   /* ~64 KB, which is a bit large for stack... */
#endif

    const BYTE* ip = (const BYTE*) source;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;
    BYTE* op = (BYTE*) dst;
    BYTE* opSaved = (BYTE*) dst;
    BYTE* oend = op + dstCapacity;
    int ovml = MINMATCH;  /* overflow - last sequence */
    const BYTE* ovref = NULL;

    /* init */
#ifdef LZ4HC_HEAPMODE
    if (opt == NULL) goto _return_label;
#endif
    DEBUGLOG(5, "LZ4HC_compress_optimal(dst=%p, dstCapa=%u)", dst, (unsigned)dstCapacity);
    *srcSizePtr = 0;
    if (limit == fillOutput) oend -= LASTLITERALS;   /* Hack for support LZ4 format restriction */
    if (sufficient_len >= LZ4_OPT_NUM) sufficient_len = LZ4_OPT_NUM-1;

    /* Main Loop */
    while (ip <= mflimit) {
         int const llen = (int)(ip - anchor);
         int best_mlen, best_off;
         int cur, last_match_pos = 0;

         LZ4HC_match_t const firstMatch = LZ4HC_FindLongerMatch(ctx, ip, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
         if (firstMatch.len==0) { ip++; continue; }

         if ((size_t)firstMatch.len > sufficient_len) {
             /* good enough solution : immediate encoding */
             int const firstML = firstMatch.len;
             const BYTE* const matchPos = ip - firstMatch.off;
             opSaved = op;
             if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), firstML, matchPos, limit, oend) ) {  /* updates ip, op and anchor */
                 ovml = firstML;
                 ovref = matchPos;
                 goto _dest_overflow;
             }
             continue;
         }

         /* set prices for first positions (literals) */
         {   int rPos;
             for (rPos = 0 ; rPos < MINMATCH ; rPos++) {
                 int const cost = LZ4HC_literalsPrice(llen + rPos);
                 opt[rPos].mlen = 1;
                 opt[rPos].off = 0;
                 opt[rPos].litlen = llen + rPos;
                 opt[rPos].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             rPos, cost, opt[rPos].litlen);
         }   }
         /* set prices using initial match */
         {   int mlen = MINMATCH;
             int const matchML = firstMatch.len;   /* necessarily < sufficient_len < LZ4_OPT_NUM */
             int const offset = firstMatch.off;
             assert(matchML < LZ4_OPT_NUM);
             for ( ; mlen <= matchML ; mlen++) {
                 int const cost = LZ4HC_sequencePrice(llen, mlen);
                 opt[mlen].mlen = mlen;
                 opt[mlen].off = offset;
                 opt[mlen].litlen = llen;
                 opt[mlen].price = cost;
                 DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i) -- initial setup",
                             mlen, cost, mlen);
         }   }
         last_match_pos = firstMatch.len;
         {   int addLit;
             for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                 opt[last_match_pos+addLit].mlen = 1; /* literal */
                 opt[last_match_pos+addLit].off = 0;
                 opt[last_match_pos+addLit].litlen = addLit;
                 opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                 DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i) -- initial setup",
                             last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
         }   }

         /* check further positions */
         for (cur = 1; cur < last_match_pos; cur++) {
             const BYTE* const curPtr = ip + cur;
             LZ4HC_match_t newMatch;

             if (curPtr > mflimit) break;
             DEBUGLOG(7, "rPos:%u[%u] vs [%u]%u",
                     cur, opt[cur].price, opt[cur+1].price, cur+1);
             if (fullUpdate) {
                 /* not useful to search here if next position has same (or lower) cost */
                 if ( (opt[cur+1].price <= opt[cur].price)
                   /* in some cases, next position has same cost, but cost rises sharply after, so a small match would still be beneficial */
                   && (opt[cur+MINMATCH].price < opt[cur].price + 3/*min seq price*/) )
                     continue;
             } else {
                 /* not useful to search here if next position has same (or lower) cost */
                 if (opt[cur+1].price <= opt[cur].price) continue;
             }

             DEBUGLOG(7, "search at rPos:%u", cur);
             if (fullUpdate)
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, MINMATCH-1, nbSearches, dict, favorDecSpeed);
             else
                 /* only test matches of minimum length; slightly faster, but misses a few bytes */
                 newMatch = LZ4HC_FindLongerMatch(ctx, curPtr, matchlimit, last_match_pos - cur, nbSearches, dict, favorDecSpeed);
             if (!newMatch.len) continue;

             if ( ((size_t)newMatch.len > sufficient_len)
               || (newMatch.len + cur >= LZ4_OPT_NUM) ) {
                 /* immediate encoding */
                 best_mlen = newMatch.len;
                 best_off = newMatch.off;
                 last_match_pos = cur + 1;
                 goto encode;
             }

             /* before match : set price with literals at beginning */
             {   int const baseLitlen = opt[cur].litlen;
                 int litlen;
                 for (litlen = 1; litlen < MINMATCH; litlen++) {
                     int const price = opt[cur].price - LZ4HC_literalsPrice(baseLitlen) + LZ4HC_literalsPrice(baseLitlen+litlen);
                     int const pos = cur + litlen;
                     if (price < opt[pos].price) {
                         opt[pos].mlen = 1; /* literal */
                         opt[pos].off = 0;
                         opt[pos].litlen = baseLitlen+litlen;
                         opt[pos].price = price;
                         DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)",
                                     pos, price, opt[pos].litlen);
             }   }   }

             /* set prices using match at position = cur */
             {   int const matchML = newMatch.len;
                 int ml = MINMATCH;

                 assert(cur + newMatch.len < LZ4_OPT_NUM);
                 for ( ; ml <= matchML ; ml++) {
                     int const pos = cur + ml;
                     int const offset = newMatch.off;
                     int price;
                     int ll;
                     DEBUGLOG(7, "testing price rPos %i (last_match_pos=%i)",
                                 pos, last_match_pos);
                     if (opt[cur].mlen == 1) {
                         ll = opt[cur].litlen;
                         price = ((cur > ll) ? opt[cur - ll].price : 0)
                               + LZ4HC_sequencePrice(ll, ml);
                     } else {
                         ll = 0;
                         price = opt[cur].price + LZ4HC_sequencePrice(0, ml);
                     }

                    assert((U32)favorDecSpeed <= 1);
                     if (pos > last_match_pos+TRAILING_LITERALS
                      || price <= opt[pos].price - (int)favorDecSpeed) {
                         DEBUGLOG(7, "rPos:%3i => price:%3i (matchlen=%i)",
                                     pos, price, ml);
                         assert(pos < LZ4_OPT_NUM);
                         if ( (ml == matchML)  /* last pos of last match */
                           && (last_match_pos < pos) )
                             last_match_pos = pos;
                         opt[pos].mlen = ml;
                         opt[pos].off = offset;
                         opt[pos].litlen = ll;
                         opt[pos].price = price;
             }   }   }
             /* complete following positions with literals */
             {   int addLit;
                 for (addLit = 1; addLit <= TRAILING_LITERALS; addLit ++) {
                     opt[last_match_pos+addLit].mlen = 1; /* literal */
                     opt[last_match_pos+addLit].off = 0;
                     opt[last_match_pos+addLit].litlen = addLit;
                     opt[last_match_pos+addLit].price = opt[last_match_pos].price + LZ4HC_literalsPrice(addLit);
                     DEBUGLOG(7, "rPos:%3i => price:%3i (litlen=%i)", last_match_pos+addLit, opt[last_match_pos+addLit].price, addLit);
             }   }
         }  /* for (cur = 1; cur <= last_match_pos; cur++) */

         assert(last_match_pos < LZ4_OPT_NUM + TRAILING_LITERALS);
         best_mlen = opt[last_match_pos].mlen;
         best_off = opt[last_match_pos].off;
         cur = last_match_pos - best_mlen;

encode: /* cur, last_match_pos, best_mlen, best_off must be set */
         assert(cur < LZ4_OPT_NUM);
         assert(last_match_pos >= 1);  /* == 1 when only one candidate */
         DEBUGLOG(6, "reverse traversal, looking for shortest path (last_match_pos=%i)", last_match_pos);
         {   int candidate_pos = cur;
             int selected_matchLength = best_mlen;
             int selected_offset = best_off;
             while (1) {  /* from end to beginning */
                 int const next_matchLength = opt[candidate_pos].mlen;  /* can be 1, means literal */
                 int const next_offset = opt[candidate_pos].off;
                 DEBUGLOG(7, "pos %i: sequence length %i", candidate_pos, selected_matchLength);
                 opt[candidate_pos].mlen = selected_matchLength;
                 opt[candidate_pos].off = selected_offset;
                 selected_matchLength = next_matchLength;
                 selected_offset = next_offset;
                 if (next_matchLength > candidate_pos) break; /* last match elected, first match to encode */
                 assert(next_matchLength > 0);  /* can be 1, means literal */
                 candidate_pos -= next_matchLength;
         }   }

         /* encode all recorded sequences in order */
         {   int rPos = 0;  /* relative position (to ip) */
             while (rPos < last_match_pos) {
                 int const ml = opt[rPos].mlen;
                 int const offset = opt[rPos].off;
                 if (ml == 1) { ip++; rPos++; continue; }  /* literal; note: can end up with several literals, in which case, skip them */
                 rPos += ml;
                 assert(ml >= MINMATCH);
                 assert((offset >= 1) && (offset <= LZ4_DISTANCE_MAX));
                 opSaved = op;
                 if ( LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ml, ip - offset, limit, oend) ) {  /* updates ip, op and anchor */
                     ovml = ml;
                     ovref = ip - offset;
                     goto _dest_overflow;
         }   }   }
     }  /* while (ip <= mflimit) */

_last_literals:
     /* Encode Last Literals */
     {   size_t lastRunSize = (size_t)(iend - anchor);  /* literals */
         size_t llAdd = (lastRunSize + 255 - RUN_MASK) / 255;
         size_t const totalSize = 1 + llAdd + lastRunSize;
         if (limit == fillOutput) oend += LASTLITERALS;  /* restore correct value */
         if (limit && (op + totalSize > oend)) {
             if (limit == limitedOutput) { /* Check output limit */
                retval = 0;
                goto _return_label;
             }
             /* adapt lastRunSize to fill 'dst' */
             lastRunSize  = (size_t)(oend - op) - 1 /*token*/;
             llAdd = (lastRunSize + 256 - RUN_MASK) / 256;
             lastRunSize -= llAdd;
         }
         DEBUGLOG(6, "Final literal run : %i literals", (int)lastRunSize);
         ip = anchor + lastRunSize; /* can be != iend if limit==fillOutput */

         if (lastRunSize >= RUN_MASK) {
             size_t accumulator = lastRunSize - RUN_MASK;
             *op++ = (RUN_MASK << ML_BITS);
             for(; accumulator >= 255 ; accumulator -= 255) *op++ = 255;
             *op++ = (BYTE) accumulator;
         } else {
             *op++ = (BYTE)(lastRunSize << ML_BITS);
         }
         memcpy(op, anchor, lastRunSize);
         op += lastRunSize;
     }

     /* End */
     *srcSizePtr = (int) (((const char*)ip) - source);
     retval = (int) ((char*)op-dst);
     goto _return_label;

_dest_overflow:
if (limit == fillOutput) {
     /* Assumption : ip, anchor, ovml and ovref must be set correctly */
     size_t const ll = (size_t)(ip - anchor);
     size_t const ll_addbytes = (ll + 240) / 255;
     size_t const ll_totalCost = 1 + ll_addbytes + ll;
     BYTE* const maxLitPos = oend - 3; /* 2 for offset, 1 for token */
     DEBUGLOG(6, "Last sequence overflowing (only %i bytes remaining)", (int)(oend-1-opSaved));
     op = opSaved;  /* restore correct out pointer */
     if (op + ll_totalCost <= maxLitPos) {
         /* ll validated; now adjust match length */
         size_t const bytesLeftForMl = (size_t)(maxLitPos - (op+ll_totalCost));
         size_t const maxMlSize = MINMATCH + (ML_MASK-1) + (bytesLeftForMl * 255);
         assert(maxMlSize < INT_MAX); assert(ovml >= 0);
         if ((size_t)ovml > maxMlSize) ovml = (int)maxMlSize;
         if ((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1 + ovml >= MFLIMIT) {
             DEBUGLOG(6, "Space to end : %i + ml (%i)", (int)((oend + LASTLITERALS) - (op + ll_totalCost + 2) - 1), ovml);
             DEBUGLOG(6, "Before : ip = %p, anchor = %p", ip, anchor);
             LZ4HC_encodeSequence(UPDATABLE(ip, op, anchor), ovml, ovref, notLimited, oend);
             DEBUGLOG(6, "After : ip = %p, anchor = %p", ip, anchor);
     }   }
     goto _last_literals;
}
_return_label:
#ifdef LZ4HC_HEAPMODE
     FREEMEM(opt);
#endif
     return retval;
}